

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_avx2_256_64.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_stats_table_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint uVar7;
  longlong lVar8;
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  __m256i alVar12;
  __m256i alVar13;
  __m256i alVar14;
  __m256i vH_00;
  __m256i vH_01;
  __m256i vH_02;
  __m256i vH_03;
  __m256i vH_04;
  __m256i vH_05;
  __m256i vH_06;
  __m256i vH_07;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i alVar15;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  __m256i b_10;
  __m256i b_11;
  __m256i b_12;
  undefined1 auVar16 [32];
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  __m256i a_10;
  __m256i a_11;
  __m256i a_12;
  __m256i a_13;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [24];
  undefined1 auVar40 [24];
  undefined1 auVar41 [24];
  undefined1 auVar42 [24];
  longlong *plVar43;
  longlong *plVar44;
  longlong *plVar45;
  longlong *plVar46;
  long lVar47;
  ulong uVar48;
  long lVar49;
  long lVar50;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  longlong lVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  longlong lVar58;
  longlong lVar59;
  ulong uVar60;
  longlong lVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  int in_stack_00000008;
  __m256i vHL_1;
  __m256i vHS_1;
  __m256i vHM_1;
  __m256i vH_1;
  int32_t temp;
  int32_t column_len;
  int64_t *l;
  int64_t *s;
  int64_t *m;
  int64_t *t;
  __m256i cond_max;
  __m256i cond;
  __m256i case2_1;
  __m256i case1_1;
  int64_t tmp2;
  int64_t tmp_6;
  __m256i vHp;
  __m256i case2;
  __m256i case1;
  __m256i *tmp_5;
  __m256i *tmp_4;
  __m256i *tmp_3;
  __m256i *tmp_2;
  __m256i *vPS;
  __m256i *vPM;
  __m256i *vP;
  __m256i vHL;
  __m256i vHS;
  __m256i vHM;
  __m256i vH_dag;
  __m256i vH;
  __m256i vFL;
  __m256i vFS;
  __m256i vFM;
  __m256i vF_ext;
  __m256i vF;
  __m256i vEL;
  __m256i vES;
  __m256i vEM;
  __m256i vE_ext;
  __m256i vE;
  __m256i vEF_opn;
  int64_t tmp_1;
  int64_t tmp;
  __m256i_64_t e;
  __m256i_64_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m256i vPosMask;
  __m256i vMaxHL;
  __m256i vMaxHS;
  __m256i vMaxHM;
  __m256i vMaxH;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int64_t length;
  int64_t similar;
  int64_t matches;
  int64_t score;
  __m256i vOne;
  __m256i vZero;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  int64_t *boundary;
  __m256i *pvEL;
  __m256i *pvES;
  __m256i *pvEM;
  __m256i *pvE;
  __m256i *pvHLLoad;
  __m256i *pvHLStore;
  __m256i *pvHSLoad;
  __m256i *pvHSStore;
  __m256i *pvHMLoad;
  __m256i *pvHMStore;
  __m256i *pvHLoad;
  __m256i *pvHStore;
  __m256i *vProfileS;
  __m256i *vProfileM;
  __m256i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int32_t in_stack_ffffffffffffe0c8;
  int32_t in_stack_ffffffffffffe0cc;
  int32_t in_stack_ffffffffffffe0d0;
  int32_t in_stack_ffffffffffffe0d4;
  undefined4 in_stack_ffffffffffffe0d8;
  undefined4 in_stack_ffffffffffffe0dc;
  long in_stack_ffffffffffffe0e0;
  long in_stack_ffffffffffffe0e8;
  long in_stack_ffffffffffffe0f0;
  int local_1f04;
  int *in_stack_ffffffffffffe100;
  ulong local_1ef8;
  undefined4 in_stack_ffffffffffffe110;
  undefined4 in_stack_ffffffffffffe114;
  int iVar77;
  long lVar78;
  undefined8 in_stack_ffffffffffffe120;
  longlong lVar79;
  undefined8 in_stack_ffffffffffffe128;
  longlong lVar80;
  longlong in_stack_ffffffffffffe130;
  longlong lVar81;
  undefined8 in_stack_ffffffffffffe138;
  undefined8 in_stack_ffffffffffffe140;
  longlong lVar82;
  undefined8 in_stack_ffffffffffffe148;
  longlong lVar83;
  longlong in_stack_ffffffffffffe150;
  longlong lVar84;
  longlong lStack_1ea8;
  undefined1 local_1ea0 [32];
  undefined1 local_1e80 [32];
  longlong *local_1e40;
  longlong *local_1e38;
  longlong *local_1e30;
  longlong *local_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined1 local_1d80 [16];
  ulong uStack_1d70;
  ulong uStack_1d68;
  undefined1 local_1d40 [16];
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined1 local_1ce0 [32];
  undefined1 local_1cc0 [32];
  undefined1 local_1ca0 [32];
  ulong local_1c80;
  ulong uStack_1c78;
  ulong uStack_1c70;
  ulong uStack_1c68;
  undefined1 local_1c60 [32];
  undefined1 local_1c40 [32];
  undefined1 local_1c20 [32];
  undefined1 local_1c00 [32];
  long local_1be0;
  long lStack_1bd8;
  long lStack_1bd0;
  long lStack_1bc8;
  undefined1 local_1bc0 [16];
  ulong uStack_1bb0;
  ulong uStack_1ba8;
  longlong local_1ba0;
  longlong lStack_1b98;
  longlong lStack_1b90;
  longlong lStack_1b88;
  longlong local_1b80;
  longlong lStack_1b78;
  longlong lStack_1b70;
  longlong lStack_1b68;
  longlong local_1b60;
  longlong lStack_1b58;
  longlong lStack_1b50;
  longlong lStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  longlong local_1b00;
  longlong lStack_1af8;
  longlong lStack_1af0;
  longlong lStack_1ae8;
  longlong local_1ac0 [4];
  ulong local_1aa0 [6];
  int local_1a70;
  int local_1a6c;
  parasail_result_t *local_1a68;
  long local_1a60;
  long lStack_1a58;
  long lStack_1a50;
  long lStack_1a48;
  undefined1 local_1a40 [32];
  undefined1 local_1a20 [32];
  undefined1 local_1a00 [32];
  undefined1 local_19e0 [32];
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  longlong local_1940;
  longlong local_1938;
  longlong local_1930;
  ulong local_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  ulong local_18d0;
  ulong local_18c8;
  undefined1 local_18c0 [16];
  undefined1 auStack_18b0 [16];
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  int64_t *local_1868;
  __m256i *local_1860;
  __m256i *local_1858;
  __m256i *local_1850;
  __m256i *local_1848;
  longlong *local_1840;
  longlong *local_1838;
  longlong *local_1830;
  longlong *local_1828;
  longlong *local_1820;
  longlong *local_1818;
  longlong *local_1810;
  longlong *local_1808;
  long local_1800;
  long local_17f8;
  long local_17f0;
  int local_17e8;
  int local_17e4;
  int local_17e0;
  int local_17dc;
  long local_17d8;
  int local_17d0;
  int local_17cc;
  int local_17c8;
  int local_17c4;
  int local_17c0;
  int local_17bc;
  int local_17b8;
  int local_17b4;
  int local_17b0;
  int local_17ac;
  long local_17a8;
  parasail_result_t *local_1798;
  ulong local_1790;
  ulong local_1788;
  ulong local_1780;
  undefined8 local_1778;
  ulong local_1770;
  ulong local_1768;
  undefined1 local_1760 [32];
  long local_1740;
  long lStack_1738;
  long lStack_1730;
  long lStack_1728;
  long local_1720;
  long lStack_1718;
  long lStack_1710;
  long lStack_1708;
  ulong local_1700;
  ulong uStack_16f8;
  ulong uStack_16f0;
  ulong uStack_16e8;
  ulong local_16e0;
  ulong uStack_16d8;
  ulong uStack_16d0;
  ulong uStack_16c8;
  ulong local_16c0;
  ulong uStack_16b8;
  ulong uStack_16b0;
  ulong uStack_16a8;
  ulong local_16a0;
  ulong uStack_1698;
  ulong uStack_1690;
  ulong uStack_1688;
  ulong local_1680;
  ulong uStack_1678;
  ulong uStack_1670;
  ulong uStack_1668;
  ulong local_1660;
  ulong uStack_1658;
  ulong uStack_1650;
  ulong uStack_1648;
  ulong local_1640;
  ulong uStack_1638;
  ulong uStack_1630;
  ulong uStack_1628;
  ulong local_1620;
  ulong uStack_1618;
  ulong uStack_1610;
  ulong uStack_1608;
  long local_1600;
  long lStack_15f8;
  long lStack_15f0;
  long lStack_15e8;
  long local_15e0;
  long lStack_15d8;
  long lStack_15d0;
  long lStack_15c8;
  undefined1 local_15c0 [16];
  undefined1 auStack_15b0 [16];
  ulong local_15a0;
  ulong local_1598;
  ulong local_1590;
  ulong local_1588;
  undefined1 local_1580 [32];
  ulong local_1560;
  ulong local_1558;
  ulong local_1550;
  ulong local_1548;
  undefined1 local_1540 [16];
  undefined1 auStack_1530 [16];
  undefined8 local_1520;
  undefined8 local_1518;
  undefined8 local_1510;
  undefined8 local_1508;
  undefined1 local_1500 [16];
  undefined1 auStack_14f0 [16];
  ulong local_14e0;
  ulong local_14d8;
  ulong local_14d0;
  ulong local_14c8;
  undefined1 local_14c0 [16];
  undefined1 auStack_14b0 [16];
  ulong local_14a0;
  ulong local_1498;
  ulong local_1490;
  ulong local_1488;
  undefined1 local_1480 [16];
  undefined1 auStack_1470 [16];
  ulong local_1460;
  ulong local_1458;
  ulong local_1450;
  ulong local_1448;
  undefined1 local_1440 [16];
  undefined1 auStack_1430 [16];
  undefined8 local_1420;
  undefined8 local_1418;
  undefined8 local_1410;
  undefined8 local_1408;
  longlong local_1400;
  longlong lStack_13f8;
  longlong lStack_13f0;
  undefined8 uStack_13e8;
  longlong *local_13c8;
  longlong local_13c0;
  longlong lStack_13b8;
  longlong lStack_13b0;
  undefined8 uStack_13a8;
  longlong *local_1388;
  longlong local_1380;
  longlong lStack_1378;
  longlong lStack_1370;
  undefined8 uStack_1368;
  longlong *local_1348;
  ulong local_1340;
  ulong uStack_1338;
  ulong uStack_1330;
  ulong uStack_1328;
  longlong *local_1308;
  longlong local_1300;
  longlong lStack_12f8;
  longlong lStack_12f0;
  longlong lStack_12e8;
  __m256i *local_12c8;
  longlong local_12c0;
  longlong lStack_12b8;
  longlong lStack_12b0;
  longlong lStack_12a8;
  __m256i *local_1288;
  longlong local_1280;
  longlong lStack_1278;
  longlong lStack_1270;
  longlong lStack_1268;
  __m256i *local_1248;
  longlong local_1240;
  longlong lStack_1238;
  longlong lStack_1230;
  longlong lStack_1228;
  __m256i *local_1208;
  longlong local_1200;
  longlong lStack_11f8;
  longlong lStack_11f0;
  undefined8 uStack_11e8;
  longlong *local_11c8;
  longlong local_11c0;
  longlong lStack_11b8;
  longlong lStack_11b0;
  undefined8 uStack_11a8;
  longlong *local_1188;
  longlong local_1180;
  longlong lStack_1178;
  longlong lStack_1170;
  undefined8 uStack_1168;
  longlong *local_1148;
  ulong local_1140;
  ulong uStack_1138;
  ulong uStack_1130;
  ulong uStack_1128;
  longlong *local_1108;
  __m256i *local_10c8;
  longlong *local_1098;
  longlong *local_1090;
  longlong *local_1088;
  longlong *local_1080;
  longlong *local_1078;
  longlong *local_1070;
  longlong *local_1068;
  longlong *local_1060;
  longlong *local_1058;
  longlong *local_1050;
  longlong *local_1048;
  longlong *local_1040;
  longlong *local_1038;
  longlong *local_1030;
  undefined1 (*local_1028) [32];
  longlong *local_1020;
  longlong *local_1018;
  longlong *local_1010;
  longlong *local_1008;
  longlong *local_1000;
  undefined1 (*local_ff8) [32];
  undefined1 (*local_ff0) [32];
  undefined1 (*local_fe8) [32];
  __m256i *local_fe0;
  __m256i *local_fd8;
  __m256i *local_fd0;
  __m256i *local_fc8;
  longlong *local_fc0;
  longlong *local_fb8;
  longlong *local_fb0;
  longlong *local_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  longlong local_f80;
  longlong lStack_f78;
  longlong lStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  longlong local_ec0;
  longlong lStack_eb8;
  longlong lStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  longlong local_e40;
  longlong lStack_e38;
  longlong lStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  longlong lStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  long lStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  longlong local_ae0;
  longlong lStack_ad8;
  longlong lStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  longlong local_a80;
  longlong lStack_a78;
  longlong lStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  longlong local_8a0;
  longlong lStack_898;
  longlong lStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  longlong local_840;
  longlong lStack_838;
  longlong lStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  longlong local_780;
  longlong lStack_778;
  longlong lStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  longlong lStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  longlong local_720;
  longlong lStack_718;
  longlong lStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  longlong lStack_6e8;
  long local_6e0;
  long lStack_6d8;
  long lStack_6d0;
  long lStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  long local_680;
  long lStack_678;
  long lStack_670;
  long lStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  longlong lStack_628;
  long local_620;
  long lStack_618;
  long lStack_610;
  long lStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  long local_5c0;
  long lStack_5b8;
  long lStack_5b0;
  long lStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  longlong lStack_568;
  long local_560;
  long lStack_558;
  long lStack_550;
  long lStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  long local_500;
  long lStack_4f8;
  long lStack_4f0;
  long lStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  longlong lStack_4a8;
  undefined1 local_4a0 [16];
  undefined1 auStack_490 [16];
  ulong local_480;
  ulong uStack_478;
  ulong uStack_470;
  ulong uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  ulong local_440;
  ulong uStack_438;
  ulong uStack_430;
  ulong uStack_428;
  undefined1 local_420 [16];
  undefined1 auStack_410 [16];
  ulong local_400;
  ulong uStack_3f8;
  ulong uStack_3f0;
  ulong uStack_3e8;
  undefined1 local_3e0 [16];
  undefined1 auStack_3d0 [16];
  longlong local_3c0;
  longlong lStack_3b8;
  longlong lStack_3b0;
  longlong lStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  ulong local_380;
  ulong uStack_378;
  ulong uStack_370;
  ulong uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  long lStack_2a8;
  long local_2a0;
  long lStack_298;
  long lStack_290;
  long lStack_288;
  long local_280;
  long lStack_278;
  long lStack_270;
  long lStack_268;
  long local_260;
  long lStack_258;
  long lStack_250;
  long lStack_248;
  long local_240;
  long lStack_238;
  long lStack_230;
  long lStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  longlong local_200;
  longlong lStack_1f8;
  longlong lStack_1f0;
  longlong lStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  longlong local_1c0;
  longlong lStack_1b8;
  longlong lStack_1b0;
  longlong lStack_1a8;
  long local_1a0;
  long lStack_198;
  long lStack_190;
  long lStack_188;
  long local_180;
  long lStack_178;
  long lStack_170;
  long lStack_168;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  long local_c0;
  long lStack_b8;
  long lStack_b0;
  long lStack_a8;
  undefined1 local_a0 [32];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  long local_60;
  long lStack_58;
  long lStack_50;
  long lStack_48;
  
  local_17bc = 0;
  local_17c0 = 0;
  local_17c4 = 0;
  local_17c8 = 0;
  local_17cc = 0;
  local_17d0 = 0;
  local_17d8 = 0;
  local_17dc = 0;
  local_17e0 = 0;
  local_17e4 = 0;
  local_17e8 = 0;
  local_17f0 = 0;
  local_17f8 = 0;
  local_1800 = 0;
  local_1808 = (longlong *)0x0;
  local_1810 = (longlong *)0x0;
  local_1818 = (longlong *)0x0;
  local_1820 = (longlong *)0x0;
  local_1828 = (longlong *)0x0;
  local_1830 = (longlong *)0x0;
  local_1838 = (longlong *)0x0;
  local_1840 = (longlong *)0x0;
  local_1848 = (__m256i *)0x0;
  local_1850 = (__m256i *)0x0;
  local_1858 = (__m256i *)0x0;
  local_1860 = (__m256i *)0x0;
  local_1868 = (int64_t *)0x0;
  local_18c8 = 0;
  local_18d0 = 0;
  local_1928 = 0;
  local_1930 = 0;
  local_1938 = 0;
  local_1940 = 0;
  local_1a68 = (parasail_result_t *)0x0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_table_striped_profile_avx2_256_64",
            "profile");
    local_1798 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x60) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_table_striped_profile_avx2_256_64",
            "profile->profile64.score");
    local_1798 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_table_striped_profile_avx2_256_64",
            "profile->matrix");
    local_1798 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n",
            "parasail_sg_flags_stats_table_striped_profile_avx2_256_64","profile->s1Len");
    local_1798 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_stats_table_striped_profile_avx2_256_64",
            "s2");
    local_1798 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n",
            "parasail_sg_flags_stats_table_striped_profile_avx2_256_64","s2Len");
    local_1798 = (parasail_result_t *)0x0;
  }
  else if (in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n",
            "parasail_sg_flags_stats_table_striped_profile_avx2_256_64","open");
    local_1798 = (parasail_result_t *)0x0;
  }
  else if (in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n",
            "parasail_sg_flags_stats_table_striped_profile_avx2_256_64","gap");
    local_1798 = (parasail_result_t *)0x0;
  }
  else {
    local_17bc = 0;
    local_17c0 = 0;
    local_17c4 = 0;
    local_17c8 = *(int *)(in_RDI + 8);
    local_17cc = local_17c8 + -1;
    local_17d0 = in_EDX + -1;
    local_17d8 = *(long *)(in_RDI + 0x10);
    local_17dc = 4;
    local_17e0 = (local_17c8 + 3) / 4;
    local_17e4 = (local_17c8 + -1) % local_17e0;
    local_17e8 = ~((local_17c8 + -1) / local_17e0) + 4;
    local_17f0 = *(long *)(in_RDI + 0x60);
    local_17f8 = *(long *)(in_RDI + 0x68);
    local_1800 = *(long *)(in_RDI + 0x70);
    local_1768 = (ulong)in_ECX;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_1768;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = local_1768;
    local_15c0 = vpunpcklqdq_avx(auVar52,auVar62);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = local_1768;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = local_1768;
    auStack_15b0 = vpunpcklqdq_avx(auVar63,auVar72);
    local_18a0 = local_15c0._0_8_;
    uStack_1898 = local_15c0._8_8_;
    uStack_1890 = auStack_15b0._0_8_;
    uStack_1888 = auStack_15b0._8_8_;
    local_1770 = (ulong)in_R8D;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_1770;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = local_1770;
    auVar52 = vpunpcklqdq_avx(auVar53,auVar64);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_1770;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = local_1770;
    auVar53 = vpunpcklqdq_avx(auVar54,auVar73);
    local_1580._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar53;
    local_1580._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar52;
    if (-in_ECX < *(int *)(local_17d8 + 0x20)) {
      lVar47 = (long)in_ECX;
    }
    else {
      lVar47 = -(long)*(int *)(local_17d8 + 0x20);
    }
    lVar78 = lVar47 + -0x8000000000000000;
    local_1928 = lVar47 + 0x8000000000000001;
    local_18d0 = 0x7ffffffffffffffe - (long)*(int *)(local_17d8 + 0x1c);
    local_1760._8_8_ = SUB328(ZEXT832(0),4);
    local_1900 = 0;
    uStack_18f8 = local_1760._8_8_;
    uStack_18f0 = 0;
    uStack_18e8 = 0;
    local_1778 = 1;
    local_1508 = 1;
    local_1510 = 1;
    local_1518 = 1;
    local_1520 = 1;
    local_1540 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    auStack_1530 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    local_1920 = local_1540._0_8_;
    uStack_1918 = local_1540._8_8_;
    uStack_1910 = auStack_1530._0_8_;
    uStack_1908 = auStack_1530._8_8_;
    local_1930 = 0;
    local_1938 = 0;
    local_1940 = 0;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_1928;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = local_1928;
    local_1500 = vpunpcklqdq_avx(auVar55,auVar65);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = local_1928;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = local_1928;
    auStack_14f0 = vpunpcklqdq_avx(auVar66,auVar74);
    local_1960 = local_1500._0_8_;
    uStack_1958 = local_1500._8_8_;
    uStack_1950 = auStack_14f0._0_8_;
    uStack_1948 = auStack_14f0._8_8_;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = local_18d0;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = local_18d0;
    local_14c0 = vpunpcklqdq_avx(auVar56,auVar67);
    auVar68._8_8_ = 0;
    auVar68._0_8_ = local_18d0;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = local_18d0;
    auStack_14b0 = vpunpcklqdq_avx(auVar68,auVar75);
    local_1980 = local_14c0._0_8_;
    uStack_1978 = local_14c0._8_8_;
    uStack_1970 = auStack_14b0._0_8_;
    uStack_1968 = auStack_14b0._8_8_;
    local_19a0 = local_14c0._0_8_;
    uStack_1998 = local_14c0._8_8_;
    uStack_1990 = auStack_14b0._0_8_;
    uStack_1988 = auStack_14b0._8_8_;
    local_19c0 = local_1500._0_8_;
    uStack_19b8 = local_1500._8_8_;
    uStack_19b0 = auStack_14f0._0_8_;
    uStack_19a8 = auStack_14f0._8_8_;
    local_19e0._16_8_ = auStack_14f0._0_8_;
    local_19e0._0_16_ = local_1500;
    local_19e0._24_8_ = auStack_14f0._8_8_;
    local_1a00._16_8_ = auStack_14f0._0_8_;
    local_1a00._0_16_ = local_1500;
    local_1a00._24_8_ = auStack_14f0._8_8_;
    local_1a20._16_8_ = auStack_14f0._0_8_;
    local_1a20._0_16_ = local_1500;
    local_1a20._24_8_ = auStack_14f0._8_8_;
    local_1a40._16_8_ = auStack_14f0._0_8_;
    local_1a40._0_16_ = local_1500;
    local_1a40._24_8_ = auStack_14f0._8_8_;
    local_1790 = (ulong)local_17e8;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_1790;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = local_1790;
    local_1480 = vpunpcklqdq_avx(auVar57,auVar69);
    auVar70._8_8_ = 0;
    auVar70._0_8_ = local_1790;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = local_1790;
    auStack_1470 = vpunpcklqdq_avx(auVar70,auVar76);
    local_1408 = 0;
    local_1410 = 1;
    local_1418 = 2;
    local_1420 = 3;
    local_1440 = vpunpcklqdq_avx(ZEXT816(3),ZEXT816(2));
    auStack_1430 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(0));
    local_15e0 = local_1480._0_8_;
    lStack_15d8 = local_1480._8_8_;
    lStack_15d0 = auStack_1470._0_8_;
    lStack_15c8 = auStack_1470._8_8_;
    local_1600 = local_1440._0_8_;
    lStack_15f8 = local_1440._8_8_;
    lStack_15f0 = auStack_1430._0_8_;
    lStack_15e8 = auStack_1430._8_8_;
    local_1a60 = -(ulong)(local_1480._0_8_ == local_1440._0_8_);
    lStack_1a58 = -(ulong)(local_1480._8_8_ == local_1440._8_8_);
    lStack_1a50 = -(ulong)(auStack_1470._0_8_ == auStack_1430._0_8_);
    lStack_1a48 = -(ulong)(auStack_1470._8_8_ == auStack_1430._8_8_);
    local_18c8 = local_1928;
    local_17b8 = in_R9D;
    local_17b4 = in_R8D;
    local_17b0 = in_ECX;
    local_17ac = in_EDX;
    local_17a8 = in_RSI;
    local_1788 = local_18d0;
    local_1780 = local_1928;
    local_1760 = ZEXT832(0) << 0x20;
    local_15a0 = local_1768;
    local_1598 = local_1768;
    local_1590 = local_1768;
    local_1588 = local_1768;
    local_1560 = local_1770;
    local_1558 = local_1770;
    local_1550 = local_1770;
    local_1548 = local_1770;
    local_14e0 = local_1928;
    local_14d8 = local_1928;
    local_14d0 = local_1928;
    local_14c8 = local_1928;
    local_14a0 = local_18d0;
    local_1498 = local_18d0;
    local_1490 = local_18d0;
    local_1488 = local_18d0;
    local_1460 = local_1790;
    local_1458 = local_1790;
    local_1450 = local_1790;
    local_1448 = local_1790;
    local_18c0 = local_1580._0_16_;
    auStack_18b0 = local_1580._16_16_;
    local_1a68 = parasail_result_new_table3(local_17e0 * 4,in_EDX);
    if (local_1a68 == (parasail_result_t *)0x0) {
      local_1798 = (parasail_result_t *)0x0;
    }
    else {
      local_1a68->flag = local_1a68->flag | 0x4810802;
      uVar7 = 0;
      if (local_17b8 != 0) {
        uVar7 = 8;
      }
      local_1a68->flag = uVar7 | local_1a68->flag;
      uVar7 = 0;
      if (in_stack_00000008 != 0) {
        uVar7 = 0x10;
      }
      local_1a68->flag = uVar7 | local_1a68->flag;
      uVar7 = 0;
      if (s1_end != 0) {
        uVar7 = 0x4000;
      }
      local_1a68->flag = uVar7 | local_1a68->flag;
      uVar7 = 0;
      if (s2_beg != 0) {
        uVar7 = 0x8000;
      }
      local_1a68->flag = uVar7 | local_1a68->flag;
      local_1a68->flag = local_1a68->flag | 0x20000;
      local_1808 = *parasail_memalign___m256i(0x20,(long)local_17e0);
      local_1810 = *parasail_memalign___m256i(0x20,(long)local_17e0);
      local_1818 = *parasail_memalign___m256i(0x20,(long)local_17e0);
      local_1820 = *parasail_memalign___m256i(0x20,(long)local_17e0);
      local_1828 = *parasail_memalign___m256i(0x20,(long)local_17e0);
      local_1830 = *parasail_memalign___m256i(0x20,(long)local_17e0);
      local_1838 = *parasail_memalign___m256i(0x20,(long)local_17e0);
      local_1840 = *parasail_memalign___m256i(0x20,(long)local_17e0);
      local_1848 = parasail_memalign___m256i(0x20,(long)local_17e0);
      local_1850 = parasail_memalign___m256i(0x20,(long)local_17e0);
      local_1858 = parasail_memalign___m256i(0x20,(long)local_17e0);
      local_1860 = parasail_memalign___m256i(0x20,(long)local_17e0);
      local_1868 = parasail_memalign_int64_t(0x20,(long)(local_17ac + 1));
      if (local_1808 == (longlong *)0x0) {
        local_1798 = (parasail_result_t *)0x0;
      }
      else if (local_1810 == (longlong *)0x0) {
        local_1798 = (parasail_result_t *)0x0;
      }
      else if (local_1818 == (longlong *)0x0) {
        local_1798 = (parasail_result_t *)0x0;
      }
      else if (local_1820 == (longlong *)0x0) {
        local_1798 = (parasail_result_t *)0x0;
      }
      else if (local_1828 == (longlong *)0x0) {
        local_1798 = (parasail_result_t *)0x0;
      }
      else if (local_1830 == (longlong *)0x0) {
        local_1798 = (parasail_result_t *)0x0;
      }
      else if (local_1838 == (longlong *)0x0) {
        local_1798 = (parasail_result_t *)0x0;
      }
      else if (local_1840 == (longlong *)0x0) {
        local_1798 = (parasail_result_t *)0x0;
      }
      else if (local_1848 == (__m256i *)0x0) {
        local_1798 = (parasail_result_t *)0x0;
      }
      else if (local_1850 == (__m256i *)0x0) {
        local_1798 = (parasail_result_t *)0x0;
      }
      else if (local_1858 == (__m256i *)0x0) {
        local_1798 = (parasail_result_t *)0x0;
      }
      else if (local_1860 == (__m256i *)0x0) {
        local_1798 = (parasail_result_t *)0x0;
      }
      else if (local_1868 == (int64_t *)0x0) {
        local_1798 = (parasail_result_t *)0x0;
      }
      else {
        alVar9[0]._4_4_ = in_stack_ffffffffffffe0dc;
        alVar9[0]._0_4_ = in_stack_ffffffffffffe0d8;
        alVar9[1] = in_stack_ffffffffffffe0e0;
        alVar9[2] = in_stack_ffffffffffffe0e8;
        alVar9[3] = in_stack_ffffffffffffe0f0;
        parasail_memset___m256i
                  ((__m256i *)CONCAT44(in_stack_ffffffffffffe114,in_stack_ffffffffffffe110),alVar9,
                   CONCAT44(in_stack_ffffffffffffe0d4,in_stack_ffffffffffffe0d0));
        alVar10[0]._4_4_ = in_stack_ffffffffffffe0dc;
        alVar10[0]._0_4_ = in_stack_ffffffffffffe0d8;
        alVar10[1] = in_stack_ffffffffffffe0e0;
        alVar10[2] = in_stack_ffffffffffffe0e8;
        alVar10[3] = in_stack_ffffffffffffe0f0;
        parasail_memset___m256i
                  ((__m256i *)CONCAT44(in_stack_ffffffffffffe114,in_stack_ffffffffffffe110),alVar10,
                   CONCAT44(in_stack_ffffffffffffe0d4,in_stack_ffffffffffffe0d0));
        alVar11[0]._4_4_ = in_stack_ffffffffffffe0dc;
        alVar11[0]._0_4_ = in_stack_ffffffffffffe0d8;
        alVar11[1] = in_stack_ffffffffffffe0e0;
        alVar11[2] = in_stack_ffffffffffffe0e8;
        alVar11[3] = in_stack_ffffffffffffe0f0;
        parasail_memset___m256i
                  ((__m256i *)CONCAT44(in_stack_ffffffffffffe114,in_stack_ffffffffffffe110),alVar11,
                   CONCAT44(in_stack_ffffffffffffe0d4,in_stack_ffffffffffffe0d0));
        alVar12[0]._4_4_ = in_stack_ffffffffffffe0dc;
        alVar12[0]._0_4_ = in_stack_ffffffffffffe0d8;
        alVar12[1] = in_stack_ffffffffffffe0e0;
        alVar12[2] = in_stack_ffffffffffffe0e8;
        alVar12[3] = in_stack_ffffffffffffe0f0;
        parasail_memset___m256i
                  ((__m256i *)CONCAT44(in_stack_ffffffffffffe114,in_stack_ffffffffffffe110),alVar12,
                   CONCAT44(in_stack_ffffffffffffe0d4,in_stack_ffffffffffffe0d0));
        alVar13[0]._4_4_ = in_stack_ffffffffffffe0dc;
        alVar13[0]._0_4_ = in_stack_ffffffffffffe0d8;
        alVar13[1] = in_stack_ffffffffffffe0e0;
        alVar13[2] = in_stack_ffffffffffffe0e8;
        alVar13[3] = in_stack_ffffffffffffe0f0;
        parasail_memset___m256i
                  ((__m256i *)CONCAT44(in_stack_ffffffffffffe114,in_stack_ffffffffffffe110),alVar13,
                   CONCAT44(in_stack_ffffffffffffe0d4,in_stack_ffffffffffffe0d0));
        alVar14[0]._4_4_ = in_stack_ffffffffffffe0dc;
        alVar14[0]._0_4_ = in_stack_ffffffffffffe0d8;
        alVar14[1] = in_stack_ffffffffffffe0e0;
        alVar14[2] = in_stack_ffffffffffffe0e8;
        alVar14[3] = in_stack_ffffffffffffe0f0;
        parasail_memset___m256i
                  ((__m256i *)CONCAT44(in_stack_ffffffffffffe114,in_stack_ffffffffffffe110),alVar14,
                   CONCAT44(in_stack_ffffffffffffe0d4,in_stack_ffffffffffffe0d0));
        local_1a6c = 0;
        for (local_17bc = 0; local_17bc < local_17e0; local_17bc = local_17bc + 1) {
          for (local_1a70 = 0; local_1a70 < local_17dc; local_1a70 = local_1a70 + 1) {
            if (local_17b8 == 0) {
              iVar77 = -(local_17b4 * (local_1a70 * local_17e0 + local_17bc)) - local_17b0;
            }
            else {
              iVar77 = 0;
            }
            uVar48 = (ulong)iVar77;
            local_1ef8 = uVar48;
            if ((long)uVar48 < -0x8000000000000000) {
              local_1ef8 = 0x8000000000000000;
            }
            local_1aa0[local_1a70] = local_1ef8;
            in_stack_ffffffffffffe100 = (int *)(uVar48 - (long)local_17b0);
            if ((long)in_stack_ffffffffffffe100 < -0x8000000000000000) {
              in_stack_ffffffffffffe100 = (int *)0x8000000000000000;
            }
            local_1ac0[local_1a70] = (longlong)in_stack_ffffffffffffe100;
          }
          local_1098 = local_1808 + (long)local_1a6c * 4;
          *local_1098 = local_1aa0[0];
          local_1098[1] = local_1aa0[1];
          local_1098[2] = local_1aa0[2];
          local_1098[3] = local_1aa0[3];
          local_10c8 = local_1848 + local_1a6c;
          (*local_10c8)[0] = local_1ac0[0];
          (*local_10c8)[1] = local_1ac0[1];
          (*local_10c8)[2] = local_1ac0[2];
          (*local_10c8)[3] = local_1ac0[3];
          local_1a6c = local_1a6c + 1;
        }
        *local_1868 = 0;
        for (local_17bc = 1; local_17bc <= local_17ac; local_17bc = local_17bc + 1) {
          if (s1_end == 0) {
            local_1f04 = -(local_17b4 * (local_17bc + -1)) - local_17b0;
          }
          else {
            local_1f04 = 0;
          }
          in_stack_ffffffffffffe0f0 = (long)local_1f04;
          if (in_stack_ffffffffffffe0f0 < -0x8000000000000000) {
            in_stack_ffffffffffffe0f0 = -0x8000000000000000;
          }
          local_1868[local_17bc] = in_stack_ffffffffffffe0f0;
        }
        for (local_17c0 = 0; plVar46 = local_1810, plVar45 = local_1820, plVar44 = local_1830,
            plVar43 = local_1840, local_17c0 < local_17ac; local_17c0 = local_17c0 + 1) {
          local_1bc0._8_8_ = uStack_1958;
          local_1bc0._0_8_ = local_1960;
          uStack_1bb0 = uStack_1950;
          uStack_1ba8 = uStack_1948;
          local_1c00._8_8_ = uStack_18f8;
          local_1c00._0_8_ = local_1900;
          local_1c00._16_8_ = uStack_18f0;
          local_1c00._24_8_ = uStack_18e8;
          local_1c20._8_8_ = uStack_18f8;
          local_1c20._0_8_ = local_1900;
          local_1c20._16_8_ = uStack_18f0;
          local_1c20._24_8_ = uStack_18e8;
          local_1c40._8_8_ = uStack_1918;
          local_1c40._0_8_ = local_1920;
          local_1c40._16_8_ = uStack_1910;
          local_1c40._24_8_ = uStack_1908;
          local_fa8 = local_1808 + (long)(local_17e0 + -1) * 4;
          local_fb0 = local_1818 + (long)(local_17e0 + -1) * 4;
          local_fb8 = local_1828 + (long)(local_17e0 + -1) * 4;
          local_fc0 = local_1838 + (long)(local_17e0 + -1) * 4;
          auVar52 = ZEXT816(0) << 0x40;
          auVar5 = vpermq_avx2(*(undefined1 (*) [32])local_fa8,0x90);
          auVar5 = vpblendd_avx2(auVar5,ZEXT1632(auVar52),3);
          auVar6 = vpermq_avx2(*(undefined1 (*) [32])local_fb0,0x90);
          local_1ca0 = vpblendd_avx2(auVar6,ZEXT1632(auVar52),3);
          auVar6 = vpermq_avx2(*(undefined1 (*) [32])local_fb8,0x90);
          local_1cc0 = vpblendd_avx2(auVar6,ZEXT1632(auVar52),3);
          auVar6 = vpermq_avx2(*(undefined1 (*) [32])local_fc0,0x90);
          local_1ce0 = vpblendd_avx2(auVar6,ZEXT1632(auVar52),3);
          local_1c60 = vpblendd_avx2(auVar5,ZEXT832((ulong)local_1868[local_17c0]),3);
          lVar47 = local_17f0 +
                   (long)(*(int *)(*(long *)(local_17d8 + 0x10) +
                                  (ulong)*(byte *)(local_17a8 + local_17c0) * 4) * local_17e0) *
                   0x20;
          lVar49 = local_17f8 +
                   (long)(*(int *)(*(long *)(local_17d8 + 0x10) +
                                  (ulong)*(byte *)(local_17a8 + local_17c0) * 4) * local_17e0) *
                   0x20;
          lVar50 = local_1800 +
                   (long)(*(int *)(*(long *)(local_17d8 + 0x10) +
                                  (ulong)*(byte *)(local_17a8 + local_17c0) * 4) * local_17e0) *
                   0x20;
          local_1810 = local_1808;
          local_1808 = plVar46;
          local_1820 = local_1818;
          local_1818 = plVar45;
          local_1830 = local_1828;
          local_1828 = plVar44;
          local_1840 = local_1838;
          local_1838 = plVar43;
          for (local_17bc = 0; local_17bc < local_17e0; local_17bc = local_17bc + 1) {
            local_fc8 = local_1848 + local_17bc;
            lVar82 = (*local_fc8)[0];
            lVar83 = (*local_fc8)[1];
            lVar84 = (*local_fc8)[2];
            lVar79 = (*local_fc8)[3];
            alVar9 = *local_fc8;
            local_fd0 = local_1850 + local_17bc;
            auVar39 = *(undefined1 (*) [24])*local_fd0;
            lVar80 = (*local_fd0)[3];
            alVar13 = *local_fd0;
            alVar10 = *local_fd0;
            local_fd8 = local_1858 + local_17bc;
            auVar40 = *(undefined1 (*) [24])*local_fd8;
            lVar81 = (*local_fd8)[3];
            alVar14 = *local_fd8;
            alVar11 = *local_fd8;
            local_fe0 = local_1860 + local_17bc;
            auVar41 = *(undefined1 (*) [24])*local_fe0;
            lVar8 = (*local_fe0)[3];
            alVar15 = *local_fe0;
            alVar12 = *local_fe0;
            local_fe8 = (undefined1 (*) [32])(lVar47 + (long)local_17bc * 0x20);
            local_d20 = *(undefined8 *)*local_fe8;
            uStack_d18 = *(undefined8 *)(*local_fe8 + 8);
            uStack_d10 = *(undefined8 *)(*local_fe8 + 0x10);
            uStack_d08 = *(undefined8 *)(*local_fe8 + 0x18);
            local_d00 = local_1c60._0_8_;
            uStack_cf8 = local_1c60._8_8_;
            uStack_cf0 = local_1c60._16_8_;
            uStack_ce8 = local_1c60._24_8_;
            auVar5 = vpaddq_avx2(local_1c60,*local_fe8);
            local_1c80 = auVar5._0_8_;
            uStack_1c78 = auVar5._8_8_;
            uStack_1c70 = auVar5._16_8_;
            uStack_1c68 = auVar5._24_8_;
            a[1] = in_stack_ffffffffffffe140;
            a[0] = in_stack_ffffffffffffe138;
            a[2] = in_stack_ffffffffffffe148;
            a[3] = in_stack_ffffffffffffe150;
            b[1] = in_stack_ffffffffffffe120;
            b[0] = lVar78;
            b[2] = in_stack_ffffffffffffe128;
            b[3] = in_stack_ffffffffffffe130;
            local_1c60._0_8_ = local_1c80;
            local_1c60._8_8_ = uStack_1c78;
            uVar48 = uStack_1c70;
            uVar60 = uStack_1c68;
            _mm256_max_epi64_rpl(a,b);
            a_00[1] = in_stack_ffffffffffffe140;
            a_00[0] = in_stack_ffffffffffffe138;
            a_00[2] = in_stack_ffffffffffffe148;
            a_00[3] = in_stack_ffffffffffffe150;
            b_00[1] = in_stack_ffffffffffffe120;
            b_00[0] = lVar78;
            b_00[2] = in_stack_ffffffffffffe128;
            b_00[3] = in_stack_ffffffffffffe130;
            _mm256_max_epi64_rpl(a_00,b_00);
            local_1108 = local_1808 + (long)local_17bc * 4;
            *local_1108 = local_1c60._0_8_;
            local_1108[1] = local_1c60._8_8_;
            local_1108[2] = uVar48;
            local_1108[3] = uVar60;
            local_1640 = local_1c80;
            uStack_1638 = uStack_1c78;
            uStack_1630 = uStack_1c70;
            uStack_1628 = uStack_1c68;
            local_6e0 = -(ulong)(local_1c60._0_8_ == local_1c80);
            lStack_6d8 = -(ulong)(local_1c60._8_8_ == uStack_1c78);
            lStack_6d0 = -(ulong)(uVar48 == uStack_1c70);
            lStack_6c8 = -(ulong)(uVar60 == uStack_1c68);
            local_1d40._8_8_ = lStack_6d8;
            local_1d40._0_8_ = local_6e0;
            local_1680 = local_1bc0._0_8_;
            uStack_1678 = local_1bc0._8_8_;
            uStack_1670 = uStack_1bb0;
            uStack_1668 = uStack_1ba8;
            local_680 = -(ulong)(local_1c60._0_8_ == local_1bc0._0_8_);
            lStack_678 = -(ulong)(local_1c60._8_8_ == local_1bc0._8_8_);
            lStack_670 = -(ulong)(uVar48 == uStack_1bb0);
            lStack_668 = -(ulong)(uVar60 == uStack_1ba8);
            local_1b60 = auVar39._0_8_;
            lStack_1b58 = auVar39._8_8_;
            lStack_1b50 = auVar39._16_8_;
            local_4c0 = local_1b60;
            uStack_4b8 = lStack_1b58;
            uStack_4b0 = lStack_1b50;
            local_4e0 = local_1c00._0_8_;
            uStack_4d8 = local_1c00._8_8_;
            uStack_4d0 = local_1c00._16_8_;
            uStack_4c8 = local_1c00._24_8_;
            auVar23._8_8_ = lStack_678;
            auVar23._0_8_ = local_680;
            auVar23._16_8_ = lStack_670;
            auVar23._24_8_ = lStack_668;
            local_520 = vpblendvb_avx2((undefined1  [32])alVar10,local_1c00,auVar23);
            local_ff0 = (undefined1 (*) [32])(lVar49 + (long)local_17bc * 0x20);
            local_d60 = *(undefined8 *)*local_ff0;
            uStack_d58 = *(undefined8 *)(*local_ff0 + 8);
            uStack_d50 = *(undefined8 *)(*local_ff0 + 0x10);
            uStack_d48 = *(undefined8 *)(*local_ff0 + 0x18);
            local_d40 = local_1ca0._0_8_;
            uStack_d38 = local_1ca0._8_8_;
            uStack_d30 = local_1ca0._16_8_;
            uStack_d28 = local_1ca0._24_8_;
            local_540 = vpaddq_avx2(local_1ca0,*local_ff0);
            auVar22._16_8_ = lStack_6d0;
            auVar22._0_16_ = local_1d40;
            auVar22._24_8_ = lStack_6c8;
            auVar5 = vpblendvb_avx2(local_520,local_540,auVar22);
            local_1148 = local_1818 + (long)local_17bc * 4;
            local_1ca0._0_8_ = auVar5._0_8_;
            local_1ca0._8_8_ = auVar5._8_8_;
            local_1ca0._16_8_ = auVar5._16_8_;
            local_1ca0._24_8_ = auVar5._24_8_;
            local_1180 = local_1ca0._0_8_;
            lStack_1178 = local_1ca0._8_8_;
            lStack_1170 = local_1ca0._16_8_;
            uStack_1168 = local_1ca0._24_8_;
            *local_1148 = local_1ca0._0_8_;
            local_1148[1] = local_1ca0._8_8_;
            local_1148[2] = local_1ca0._16_8_;
            local_1148[3] = local_1ca0._24_8_;
            local_1b80 = auVar40._0_8_;
            lStack_1b78 = auVar40._8_8_;
            lStack_1b70 = auVar40._16_8_;
            local_580 = local_1b80;
            uStack_578 = lStack_1b78;
            uStack_570 = lStack_1b70;
            local_5a0 = local_1c20._0_8_;
            uStack_598 = local_1c20._8_8_;
            uStack_590 = local_1c20._16_8_;
            uStack_588 = local_1c20._24_8_;
            auVar4._8_8_ = lStack_678;
            auVar4._0_8_ = local_680;
            auVar4._16_8_ = lStack_670;
            auVar4._24_8_ = lStack_668;
            local_5e0 = vpblendvb_avx2((undefined1  [32])alVar11,local_1c20,auVar4);
            local_ff8 = (undefined1 (*) [32])(lVar50 + (long)local_17bc * 0x20);
            local_da0 = *(undefined8 *)*local_ff8;
            uStack_d98 = *(undefined8 *)(*local_ff8 + 8);
            uStack_d90 = *(undefined8 *)(*local_ff8 + 0x10);
            uStack_d88 = *(undefined8 *)(*local_ff8 + 0x18);
            local_d80 = local_1cc0._0_8_;
            uStack_d78 = local_1cc0._8_8_;
            uStack_d70 = local_1cc0._16_8_;
            uStack_d68 = local_1cc0._24_8_;
            local_600 = vpaddq_avx2(local_1cc0,*local_ff8);
            auVar3._16_8_ = lStack_6d0;
            auVar3._0_16_ = local_1d40;
            auVar3._24_8_ = lStack_6c8;
            auVar6 = vpblendvb_avx2(local_5e0,local_600,auVar3);
            local_1188 = local_1828 + (long)local_17bc * 4;
            local_1cc0._0_8_ = auVar6._0_8_;
            local_1cc0._8_8_ = auVar6._8_8_;
            local_1cc0._16_8_ = auVar6._16_8_;
            local_1cc0._24_8_ = auVar6._24_8_;
            local_11c0 = local_1cc0._0_8_;
            lStack_11b8 = local_1cc0._8_8_;
            lStack_11b0 = local_1cc0._16_8_;
            uStack_11a8 = local_1cc0._24_8_;
            *local_1188 = local_1cc0._0_8_;
            local_1188[1] = local_1cc0._8_8_;
            local_1188[2] = local_1cc0._16_8_;
            local_1188[3] = local_1cc0._24_8_;
            local_1ba0 = auVar41._0_8_;
            lStack_1b98 = auVar41._8_8_;
            lStack_1b90 = auVar41._16_8_;
            local_640 = local_1ba0;
            uStack_638 = lStack_1b98;
            uStack_630 = lStack_1b90;
            local_660 = local_1c40._0_8_;
            uStack_658 = local_1c40._8_8_;
            uStack_650 = local_1c40._16_8_;
            uStack_648 = local_1c40._24_8_;
            auVar2._8_8_ = lStack_678;
            auVar2._0_8_ = local_680;
            auVar2._16_8_ = lStack_670;
            auVar2._24_8_ = lStack_668;
            local_6a0 = vpblendvb_avx2((undefined1  [32])alVar12,local_1c40,auVar2);
            local_dc0 = local_1ce0._0_8_;
            uStack_db8 = local_1ce0._8_8_;
            uStack_db0 = local_1ce0._16_8_;
            uStack_da8 = local_1ce0._24_8_;
            local_de0 = local_1920;
            uStack_dd8 = uStack_1918;
            uStack_dd0 = uStack_1910;
            uStack_dc8 = uStack_1908;
            auVar1._8_8_ = uStack_1918;
            auVar1._0_8_ = local_1920;
            auVar1._16_8_ = uStack_1910;
            auVar1._24_8_ = uStack_1908;
            local_6c0 = vpaddq_avx2(local_1ce0,auVar1);
            auVar71._16_8_ = lStack_6d0;
            auVar71._0_16_ = local_1d40;
            auVar71._24_8_ = lStack_6c8;
            auVar1 = vpblendvb_avx2(local_6a0,local_6c0,auVar71);
            local_11c8 = local_1838 + (long)local_17bc * 4;
            local_1ce0._0_8_ = auVar1._0_8_;
            local_1ce0._8_8_ = auVar1._8_8_;
            local_1ce0._16_8_ = auVar1._16_8_;
            local_1ce0._24_8_ = auVar1._24_8_;
            local_1200 = local_1ce0._0_8_;
            lStack_11f8 = local_1ce0._8_8_;
            lStack_11f0 = local_1ce0._16_8_;
            uStack_11e8 = local_1ce0._24_8_;
            *local_11c8 = local_1ce0._0_8_;
            local_11c8[1] = local_1ce0._8_8_;
            local_11c8[2] = local_1ce0._16_8_;
            local_11c8[3] = local_1ce0._24_8_;
            a_01[1] = in_stack_ffffffffffffe140;
            a_01[0] = in_stack_ffffffffffffe138;
            a_01[2] = in_stack_ffffffffffffe148;
            a_01[3] = in_stack_ffffffffffffe150;
            b_01[1] = in_stack_ffffffffffffe120;
            b_01[0] = lVar78;
            b_01[2] = in_stack_ffffffffffffe128;
            b_01[3] = in_stack_ffffffffffffe130;
            local_1660 = local_1c60._0_8_;
            uStack_1658 = local_1c60._8_8_;
            uStack_1650 = uVar48;
            uStack_1648 = uVar60;
            local_1620 = local_1c60._0_8_;
            uStack_1618 = local_1c60._8_8_;
            uStack_1610 = uVar48;
            uStack_1608 = uVar60;
            local_1140 = local_1c60._0_8_;
            uStack_1138 = local_1c60._8_8_;
            uStack_1130 = uVar48;
            uStack_1128 = uVar60;
            lStack_628 = lVar8;
            local_620 = local_6e0;
            lStack_618 = lStack_6d8;
            lStack_610 = lStack_6d0;
            lStack_608 = lStack_6c8;
            local_5c0 = local_680;
            lStack_5b8 = lStack_678;
            lStack_5b0 = lStack_670;
            lStack_5a8 = lStack_668;
            lStack_568 = lVar81;
            local_560 = local_6e0;
            lStack_558 = lStack_6d8;
            lStack_550 = lStack_6d0;
            lStack_548 = lStack_6c8;
            local_500 = local_680;
            lStack_4f8 = lStack_678;
            lStack_4f0 = lStack_670;
            lStack_4e8 = lStack_668;
            lStack_4a8 = lVar80;
            _mm256_min_epi64_rpl(a_01,b_01);
            a_02[1] = in_stack_ffffffffffffe140;
            a_02[0] = in_stack_ffffffffffffe138;
            a_02[2] = in_stack_ffffffffffffe148;
            a_02[3] = in_stack_ffffffffffffe150;
            b_02[1] = in_stack_ffffffffffffe120;
            b_02[0] = lVar78;
            b_02[2] = in_stack_ffffffffffffe128;
            b_02[3] = in_stack_ffffffffffffe130;
            _mm256_max_epi64_rpl(a_02,b_02);
            a_03[1] = in_stack_ffffffffffffe140;
            a_03[0] = in_stack_ffffffffffffe138;
            a_03[2] = in_stack_ffffffffffffe148;
            a_03[3] = in_stack_ffffffffffffe150;
            b_03[1] = in_stack_ffffffffffffe120;
            b_03[0] = lVar78;
            b_03[2] = in_stack_ffffffffffffe128;
            b_03[3] = in_stack_ffffffffffffe130;
            _mm256_max_epi64_rpl(a_03,b_03);
            a_04[1] = in_stack_ffffffffffffe140;
            a_04[0] = in_stack_ffffffffffffe138;
            a_04[2] = in_stack_ffffffffffffe148;
            a_04[3] = in_stack_ffffffffffffe150;
            b_04[1] = in_stack_ffffffffffffe120;
            b_04[0] = lVar78;
            b_04[2] = in_stack_ffffffffffffe128;
            b_04[3] = in_stack_ffffffffffffe130;
            _mm256_max_epi64_rpl(a_04,b_04);
            a_05[1] = in_stack_ffffffffffffe140;
            a_05[0] = in_stack_ffffffffffffe138;
            a_05[2] = in_stack_ffffffffffffe148;
            a_05[3] = in_stack_ffffffffffffe150;
            b_05[1] = in_stack_ffffffffffffe120;
            b_05[0] = lVar78;
            b_05[2] = in_stack_ffffffffffffe128;
            b_05[3] = in_stack_ffffffffffffe130;
            _mm256_max_epi64_rpl(a_05,b_05);
            vH_00[0]._4_4_ = in_stack_ffffffffffffe0dc;
            vH_00[0]._0_4_ = in_stack_ffffffffffffe0d8;
            vH_00[1] = in_stack_ffffffffffffe0e0;
            vH_00[2] = in_stack_ffffffffffffe0e8;
            vH_00[3] = in_stack_ffffffffffffe0f0;
            arr_store_si256(in_stack_ffffffffffffe100,vH_00,in_stack_ffffffffffffe0d4,
                            in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0cc,
                            in_stack_ffffffffffffe0c8);
            vH_01[0]._4_4_ = in_stack_ffffffffffffe0dc;
            vH_01[0]._0_4_ = in_stack_ffffffffffffe0d8;
            vH_01[1] = in_stack_ffffffffffffe0e0;
            vH_01[2] = in_stack_ffffffffffffe0e8;
            vH_01[3] = in_stack_ffffffffffffe0f0;
            arr_store_si256(in_stack_ffffffffffffe100,vH_01,in_stack_ffffffffffffe0d4,
                            in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0cc,
                            in_stack_ffffffffffffe0c8);
            vH_02[0]._4_4_ = in_stack_ffffffffffffe0dc;
            vH_02[0]._0_4_ = in_stack_ffffffffffffe0d8;
            vH_02[1] = in_stack_ffffffffffffe0e0;
            vH_02[2] = in_stack_ffffffffffffe0e8;
            vH_02[3] = in_stack_ffffffffffffe0f0;
            arr_store_si256(in_stack_ffffffffffffe100,vH_02,in_stack_ffffffffffffe0d4,
                            in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0cc,
                            in_stack_ffffffffffffe0c8);
            vH_03[0]._4_4_ = in_stack_ffffffffffffe0dc;
            vH_03[0]._0_4_ = in_stack_ffffffffffffe0d8;
            vH_03[1] = in_stack_ffffffffffffe0e0;
            vH_03[2] = in_stack_ffffffffffffe0e8;
            vH_03[3] = in_stack_ffffffffffffe0f0;
            arr_store_si256(in_stack_ffffffffffffe100,vH_03,in_stack_ffffffffffffe0d4,
                            in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0cc,
                            in_stack_ffffffffffffe0c8);
            local_3a0 = local_18a0;
            uStack_398 = uStack_1898;
            uStack_390 = uStack_1890;
            uStack_388 = uStack_1888;
            auVar30._16_8_ = uVar48;
            auVar30._0_16_ = local_1c60._0_16_;
            auVar30._24_8_ = uVar60;
            auVar29._8_8_ = uStack_1898;
            auVar29._0_8_ = local_18a0;
            auVar29._16_8_ = uStack_1890;
            auVar29._24_8_ = uStack_1888;
            auVar4 = vpsubq_avx2(auVar30,auVar29);
            auVar28._16_8_ = auStack_18b0._0_8_;
            auVar28._0_16_ = local_18c0;
            auVar28._24_8_ = auStack_18b0._8_8_;
            auVar71 = vpsubq_avx2((undefined1  [32])alVar9,auVar28);
            local_1b00 = auVar4._0_8_;
            lStack_1af8 = auVar4._8_8_;
            lStack_1af0 = auVar4._16_8_;
            lStack_1ae8 = auVar4._24_8_;
            a_06[1] = in_stack_ffffffffffffe140;
            a_06[0] = in_stack_ffffffffffffe138;
            a_06[2] = in_stack_ffffffffffffe148;
            a_06[3] = in_stack_ffffffffffffe150;
            b_06[1] = in_stack_ffffffffffffe120;
            b_06[0] = lVar78;
            b_06[2] = in_stack_ffffffffffffe128;
            b_06[3] = in_stack_ffffffffffffe130;
            lVar51 = local_1b00;
            lVar58 = lStack_1af8;
            lVar59 = lStack_1af0;
            lVar61 = lStack_1ae8;
            local_3c0 = lVar82;
            lStack_3b8 = lVar83;
            lStack_3b0 = lVar84;
            lStack_3a8 = lVar79;
            local_380 = local_1c60._0_8_;
            uStack_378 = local_1c60._8_8_;
            uStack_370 = uVar48;
            uStack_368 = uVar60;
            local_3e0 = local_18c0;
            auStack_3d0 = auStack_18b0;
            _mm256_max_epi64_rpl(a_06,b_06);
            local_1b40 = auVar71._0_8_;
            uStack_1b38 = auVar71._8_8_;
            uStack_1b30 = auVar71._16_8_;
            uStack_1b28 = auVar71._24_8_;
            local_1c0 = local_1b00;
            lStack_1b8 = lStack_1af8;
            lStack_1b0 = lStack_1af0;
            lStack_1a8 = lStack_1ae8;
            local_1e0 = local_1b40;
            uStack_1d8 = uStack_1b38;
            uStack_1d0 = uStack_1b30;
            uStack_1c8 = uStack_1b28;
            auVar3 = vpcmpgtq_avx2(auVar4,auVar71);
            local_1d40._0_8_ = auVar3._0_8_;
            local_1d40._8_8_ = auVar3._8_8_;
            uStack_1d30 = auVar3._16_8_;
            uStack_1d28 = auVar3._24_8_;
            local_700 = local_1b60;
            uStack_6f8 = lStack_1b58;
            uStack_6f0 = lStack_1b50;
            local_720 = local_1ca0._0_8_;
            lStack_718 = local_1ca0._8_8_;
            lStack_710 = local_1ca0._16_8_;
            uStack_708 = local_1ca0._24_8_;
            local_740 = local_1d40._0_8_;
            uStack_738 = local_1d40._8_8_;
            uStack_730 = uStack_1d30;
            uStack_728 = uStack_1d28;
            auVar71 = vpblendvb_avx2((undefined1  [32])alVar13,auVar5,auVar3);
            local_760 = local_1b80;
            uStack_758 = lStack_1b78;
            uStack_750 = lStack_1b70;
            local_780 = local_1cc0._0_8_;
            lStack_778 = local_1cc0._8_8_;
            lStack_770 = local_1cc0._16_8_;
            uStack_768 = local_1cc0._24_8_;
            local_7a0 = local_1d40._0_8_;
            uStack_798 = local_1d40._8_8_;
            uStack_790 = uStack_1d30;
            uStack_788 = uStack_1d28;
            auVar2 = vpblendvb_avx2((undefined1  [32])alVar14,auVar6,auVar3);
            local_e00 = local_1ba0;
            uStack_df8 = lStack_1b98;
            uStack_df0 = lStack_1b90;
            local_e20 = local_1920;
            uStack_e18 = uStack_1918;
            uStack_e10 = uStack_1910;
            uStack_e08 = uStack_1908;
            auVar21._8_8_ = uStack_1918;
            auVar21._0_8_ = local_1920;
            auVar21._16_8_ = uStack_1910;
            auVar21._24_8_ = uStack_1908;
            local_7c0 = vpaddq_avx2((undefined1  [32])alVar15,auVar21);
            local_e40 = local_1ce0._0_8_;
            lStack_e38 = local_1ce0._8_8_;
            lStack_e30 = local_1ce0._16_8_;
            uStack_e28 = local_1ce0._24_8_;
            local_e60 = local_1920;
            uStack_e58 = uStack_1918;
            uStack_e50 = uStack_1910;
            uStack_e48 = uStack_1908;
            auVar20._8_8_ = uStack_1918;
            auVar20._0_8_ = local_1920;
            auVar20._16_8_ = uStack_1910;
            auVar20._24_8_ = uStack_1908;
            local_7e0 = vpaddq_avx2(auVar1,auVar20);
            local_800 = local_1d40._0_8_;
            uStack_7f8 = local_1d40._8_8_;
            uStack_7f0 = uStack_1d30;
            uStack_7e8 = uStack_1d28;
            auVar3 = vpblendvb_avx2(local_7c0,local_7e0,auVar3);
            local_1208 = local_1848 + local_17bc;
            (*local_1208)[0] = lVar51;
            (*local_1208)[1] = lVar58;
            (*local_1208)[2] = lVar59;
            (*local_1208)[3] = lVar61;
            local_1248 = local_1850 + local_17bc;
            local_1b60 = auVar71._0_8_;
            lStack_1b58 = auVar71._8_8_;
            lStack_1b50 = auVar71._16_8_;
            lStack_1b48 = auVar71._24_8_;
            local_1280 = local_1b60;
            lStack_1278 = lStack_1b58;
            lStack_1270 = lStack_1b50;
            lStack_1268 = lStack_1b48;
            (*local_1248)[0] = local_1b60;
            (*local_1248)[1] = lStack_1b58;
            (*local_1248)[2] = lStack_1b50;
            (*local_1248)[3] = lStack_1b48;
            local_1288 = local_1858 + local_17bc;
            local_1b80 = auVar2._0_8_;
            lStack_1b78 = auVar2._8_8_;
            lStack_1b70 = auVar2._16_8_;
            lStack_1b68 = auVar2._24_8_;
            local_12c0 = local_1b80;
            lStack_12b8 = lStack_1b78;
            lStack_12b0 = lStack_1b70;
            lStack_12a8 = lStack_1b68;
            (*local_1288)[0] = local_1b80;
            (*local_1288)[1] = lStack_1b78;
            (*local_1288)[2] = lStack_1b70;
            (*local_1288)[3] = lStack_1b68;
            local_12c8 = local_1860 + local_17bc;
            local_1ba0 = auVar3._0_8_;
            lStack_1b98 = auVar3._8_8_;
            lStack_1b90 = auVar3._16_8_;
            lStack_1b88 = auVar3._24_8_;
            local_1300 = local_1ba0;
            lStack_12f8 = lStack_1b98;
            lStack_12f0 = lStack_1b90;
            lStack_12e8 = lStack_1b88;
            (*local_12c8)[0] = local_1ba0;
            (*local_12c8)[1] = lStack_1b98;
            (*local_12c8)[2] = lStack_1b90;
            (*local_12c8)[3] = lStack_1b88;
            local_400 = local_1bc0._0_8_;
            uStack_3f8 = local_1bc0._8_8_;
            uStack_3f0 = uStack_1bb0;
            uStack_3e8 = uStack_1ba8;
            auVar27._16_8_ = auStack_18b0._0_8_;
            auVar27._0_16_ = local_18c0;
            auVar27._24_8_ = auStack_18b0._8_8_;
            auVar71 = vpsubq_avx2(_local_1bc0,auVar27);
            a_07[1] = in_stack_ffffffffffffe140;
            a_07[0] = in_stack_ffffffffffffe138;
            a_07[2] = in_stack_ffffffffffffe148;
            a_07[3] = in_stack_ffffffffffffe150;
            alVar15[1] = in_stack_ffffffffffffe120;
            alVar15[0] = lVar78;
            alVar15[2] = in_stack_ffffffffffffe128;
            alVar15[3] = in_stack_ffffffffffffe130;
            local_1bc0._0_8_ = local_1b00;
            local_1bc0._8_8_ = lStack_1af8;
            uStack_1bb0 = lStack_1af0;
            uStack_1ba8 = lStack_1ae8;
            local_1240 = lVar51;
            lStack_1238 = lVar58;
            lStack_1230 = lVar59;
            lStack_1228 = lVar61;
            lStack_de8 = lVar8;
            lStack_748 = lVar81;
            lStack_6e8 = lVar80;
            local_420 = local_18c0;
            auStack_410 = auStack_18b0;
            _mm256_max_epi64_rpl(a_07,alVar15);
            local_200 = local_1b00;
            lStack_1f8 = lStack_1af8;
            lStack_1f0 = lStack_1af0;
            lStack_1e8 = lStack_1ae8;
            local_1be0 = auVar71._0_8_;
            local_220 = local_1be0;
            lStack_1bd8 = auVar71._8_8_;
            uStack_218 = lStack_1bd8;
            lStack_1bd0 = auVar71._16_8_;
            uStack_210 = lStack_1bd0;
            lStack_1bc8 = auVar71._24_8_;
            uStack_208 = lStack_1bc8;
            auVar71 = vpcmpgtq_avx2(auVar4,auVar71);
            local_820 = local_1c00._0_8_;
            uStack_818 = local_1c00._8_8_;
            uStack_810 = local_1c00._16_8_;
            uStack_808 = local_1c00._24_8_;
            local_840 = local_1ca0._0_8_;
            lStack_838 = local_1ca0._8_8_;
            lStack_830 = local_1ca0._16_8_;
            uStack_828 = local_1ca0._24_8_;
            local_1d40._0_8_ = auVar71._0_8_;
            local_860 = local_1d40._0_8_;
            local_1d40._8_8_ = auVar71._8_8_;
            uStack_858 = local_1d40._8_8_;
            uStack_1d30 = auVar71._16_8_;
            uStack_850 = uStack_1d30;
            uStack_1d28 = auVar71._24_8_;
            uStack_848 = uStack_1d28;
            local_1c00 = vpblendvb_avx2(local_1c00,auVar5,auVar71);
            local_880 = local_1c20._0_8_;
            uStack_878 = local_1c20._8_8_;
            uStack_870 = local_1c20._16_8_;
            uStack_868 = local_1c20._24_8_;
            local_8a0 = local_1cc0._0_8_;
            lStack_898 = local_1cc0._8_8_;
            lStack_890 = local_1cc0._16_8_;
            uStack_888 = local_1cc0._24_8_;
            local_8c0 = local_1d40._0_8_;
            uStack_8b8 = local_1d40._8_8_;
            uStack_8b0 = uStack_1d30;
            uStack_8a8 = uStack_1d28;
            local_1c20 = vpblendvb_avx2(local_1c20,auVar6,auVar71);
            local_e80 = local_1c40._0_8_;
            uStack_e78 = local_1c40._8_8_;
            uStack_e70 = local_1c40._16_8_;
            uStack_e68 = local_1c40._24_8_;
            local_ea0 = local_1920;
            uStack_e98 = uStack_1918;
            uStack_e90 = uStack_1910;
            uStack_e88 = uStack_1908;
            auVar6._8_8_ = uStack_1918;
            auVar6._0_8_ = local_1920;
            auVar6._16_8_ = uStack_1910;
            auVar6._24_8_ = uStack_1908;
            local_8e0 = vpaddq_avx2(local_1c40,auVar6);
            local_ec0 = local_1ce0._0_8_;
            lStack_eb8 = local_1ce0._8_8_;
            lStack_eb0 = local_1ce0._16_8_;
            uStack_ea8 = local_1ce0._24_8_;
            local_ee0 = local_1920;
            uStack_ed8 = uStack_1918;
            uStack_ed0 = uStack_1910;
            uStack_ec8 = uStack_1908;
            auVar5._8_8_ = uStack_1918;
            auVar5._0_8_ = local_1920;
            auVar5._16_8_ = uStack_1910;
            auVar5._24_8_ = uStack_1908;
            local_900 = vpaddq_avx2(auVar1,auVar5);
            local_920 = local_1d40._0_8_;
            uStack_918 = local_1d40._8_8_;
            uStack_910 = uStack_1d30;
            uStack_908 = uStack_1d28;
            local_1c40 = vpblendvb_avx2(local_8e0,local_900,auVar71);
            local_1000 = local_1810 + (long)local_17bc * 4;
            local_1c60 = *(undefined1 (*) [32])local_1000;
            local_1008 = local_1820 + (long)local_17bc * 4;
            local_1ca0 = *(undefined1 (*) [32])local_1008;
            local_1010 = local_1830 + (long)local_17bc * 4;
            local_1cc0 = *(undefined1 (*) [32])local_1010;
            local_1018 = local_1840 + (long)local_17bc * 4;
            local_1ce0 = *(undefined1 (*) [32])local_1018;
          }
          for (local_17c4 = 0; local_17c4 < local_17dc; local_17c4 = local_17c4 + 1) {
            local_1020 = local_1810 + (long)(local_17e0 + -1) * 4;
            if (s1_end == 0) {
              in_stack_ffffffffffffe0e8 = local_1868[local_17c0 + 1] - (long)local_17b0;
            }
            else {
              in_stack_ffffffffffffe0e8 = (long)-local_17b0;
            }
            in_stack_ffffffffffffe0e0 = in_stack_ffffffffffffe0e8;
            if (in_stack_ffffffffffffe0e8 < -0x8000000000000000) {
              in_stack_ffffffffffffe0e0 = -0x8000000000000000;
            }
            auVar52 = ZEXT816(0) << 0x40;
            auVar5 = vpermq_avx2(*(undefined1 (*) [32])local_1020,0x90);
            auVar5 = vpblendd_avx2(auVar5,ZEXT1632(auVar52),3);
            auVar6 = vpermq_avx2(_local_1bc0,0x90);
            auVar6 = vpblendd_avx2(auVar6,ZEXT1632(auVar52),3);
            auVar1 = vpermq_avx2(local_1c00,0x90);
            auVar71 = ZEXT1632(auVar52);
            local_1c00 = vpblendd_avx2(auVar1,auVar71,3);
            auVar1 = vpermq_avx2(local_1c20,0x90);
            local_1c20 = vpblendd_avx2(auVar1,auVar71,3);
            auVar1 = vpermq_avx2(local_1c40,0x90);
            auVar1 = vpblendd_avx2(auVar1,auVar71,3);
            stack0xffffffffffffe288 = auVar5._8_24_;
            local_1d80._0_8_ = local_1868[local_17c0];
            stack0xffffffffffffe448 = auVar6._8_24_;
            local_1bc0._0_8_ = in_stack_ffffffffffffe0e0;
            local_1c40 = vpblendd_avx2(auVar1,ZEXT1632(SUB6416(ZEXT864(1),0)),3);
            for (local_17bc = 0; local_17bc < local_17e0; local_17bc = local_17bc + 1) {
              local_1028 = (undefined1 (*) [32])(lVar47 + (long)local_17bc * 0x20);
              local_f20 = *(undefined8 *)*local_1028;
              uStack_f18 = *(undefined8 *)(*local_1028 + 8);
              uStack_f10 = *(undefined8 *)(*local_1028 + 0x10);
              uStack_f08 = *(undefined8 *)(*local_1028 + 0x18);
              local_f00 = local_1d80._0_8_;
              uStack_ef8 = local_1d80._8_8_;
              uStack_ef0 = uStack_1d70;
              uStack_ee8 = uStack_1d68;
              auVar5 = vpaddq_avx2(_local_1d80,*local_1028);
              local_1030 = local_1808 + (long)local_17bc * 4;
              auVar39 = *(undefined1 (*) [24])local_1030;
              uVar48 = *(ulong *)*(undefined1 (*) [24])(local_1030 + 3);
              local_1c60._0_8_ = auVar39._0_8_;
              local_1c60._8_8_ = auVar39._8_8_;
              local_1c60._16_8_ = auVar39._16_8_;
              a_08[1] = in_stack_ffffffffffffe140;
              a_08[0] = in_stack_ffffffffffffe138;
              a_08[2] = in_stack_ffffffffffffe148;
              a_08[3] = in_stack_ffffffffffffe150;
              b_07[1] = in_stack_ffffffffffffe120;
              b_07[0] = lVar78;
              b_07[2] = in_stack_ffffffffffffe128;
              b_07[3] = in_stack_ffffffffffffe130;
              _mm256_max_epi64_rpl(a_08,b_07);
              local_1308 = local_1808 + (long)local_17bc * 4;
              *local_1308 = local_1c60._0_8_;
              local_1308[1] = local_1c60._8_8_;
              local_1308[2] = local_1c60._16_8_;
              local_1308[3] = uVar48;
              local_1d80._0_8_ = auVar5._0_8_;
              local_1d80._8_8_ = auVar5._8_8_;
              uStack_1d70 = auVar5._16_8_;
              uStack_1d68 = auVar5._24_8_;
              local_16c0 = local_1d80._0_8_;
              uStack_16b8 = local_1d80._8_8_;
              uStack_16b0 = uStack_1d70;
              uStack_16a8 = uStack_1d68;
              local_180 = -(ulong)(local_1c60._0_8_ == local_1d80._0_8_);
              lStack_178 = -(ulong)(local_1c60._8_8_ == local_1d80._8_8_);
              lStack_170 = -(ulong)(local_1c60._16_8_ == uStack_1d70);
              lStack_168 = -(ulong)(uVar48 == uStack_1d68);
              local_1700 = local_1bc0._0_8_;
              uStack_16f8 = local_1bc0._8_8_;
              uStack_16f0 = uStack_1bb0;
              uStack_16e8 = uStack_1ba8;
              local_1a0 = -(ulong)(local_1c60._0_8_ == local_1bc0._0_8_);
              lStack_198 = -(ulong)(local_1c60._8_8_ == local_1bc0._8_8_);
              lStack_190 = -(ulong)(local_1c60._16_8_ == uStack_1bb0);
              lStack_188 = -(ulong)(uVar48 == uStack_1ba8);
              auVar36._8_8_ = lStack_178;
              auVar36._0_8_ = local_180;
              auVar36._16_8_ = lStack_170;
              auVar36._24_8_ = lStack_168;
              auVar35._8_8_ = lStack_198;
              auVar35._0_8_ = local_1a0;
              auVar35._16_8_ = lStack_190;
              auVar35._24_8_ = lStack_188;
              auVar5 = vpandn_avx2(auVar36,auVar35);
              local_1038 = local_1818 + (long)local_17bc * 4;
              auVar39 = *(undefined1 (*) [24])local_1038;
              uStack_928 = *(undefined8 *)*(undefined1 (*) [24])(local_1038 + 3);
              local_1ca0._0_8_ = auVar39._0_8_;
              local_1ca0._8_8_ = auVar39._8_8_;
              local_1ca0._16_8_ = auVar39._16_8_;
              local_1e00 = auVar5._0_8_;
              uStack_1df8 = auVar5._8_8_;
              uStack_1df0 = auVar5._16_8_;
              uStack_1de8 = auVar5._24_8_;
              local_940 = local_1ca0._0_8_;
              uStack_938 = local_1ca0._8_8_;
              uStack_930 = local_1ca0._16_8_;
              local_960 = local_1c00._0_8_;
              uStack_958 = local_1c00._8_8_;
              uStack_950 = local_1c00._16_8_;
              uStack_948 = local_1c00._24_8_;
              local_980 = local_1e00;
              uStack_978 = uStack_1df8;
              uStack_970 = uStack_1df0;
              uStack_968 = uStack_1de8;
              auVar6 = vpblendvb_avx2(*(undefined1 (*) [32])local_1038,local_1c00,auVar5);
              local_1348 = local_1818 + (long)local_17bc * 4;
              local_1ca0._0_8_ = auVar6._0_8_;
              local_1ca0._8_8_ = auVar6._8_8_;
              local_1ca0._16_8_ = auVar6._16_8_;
              local_1ca0._24_8_ = auVar6._24_8_;
              local_1380 = local_1ca0._0_8_;
              lStack_1378 = local_1ca0._8_8_;
              lStack_1370 = local_1ca0._16_8_;
              uStack_1368 = local_1ca0._24_8_;
              *local_1348 = local_1ca0._0_8_;
              local_1348[1] = local_1ca0._8_8_;
              local_1348[2] = local_1ca0._16_8_;
              local_1348[3] = local_1ca0._24_8_;
              local_1040 = local_1828 + (long)local_17bc * 4;
              auVar39 = *(undefined1 (*) [24])local_1040;
              uStack_988 = *(undefined8 *)*(undefined1 (*) [24])(local_1040 + 3);
              local_1cc0._0_8_ = auVar39._0_8_;
              local_1cc0._8_8_ = auVar39._8_8_;
              local_1cc0._16_8_ = auVar39._16_8_;
              local_9a0 = local_1cc0._0_8_;
              uStack_998 = local_1cc0._8_8_;
              uStack_990 = local_1cc0._16_8_;
              local_9c0 = local_1c20._0_8_;
              uStack_9b8 = local_1c20._8_8_;
              uStack_9b0 = local_1c20._16_8_;
              uStack_9a8 = local_1c20._24_8_;
              local_9e0 = local_1e00;
              uStack_9d8 = uStack_1df8;
              uStack_9d0 = uStack_1df0;
              uStack_9c8 = uStack_1de8;
              auVar1 = vpblendvb_avx2(*(undefined1 (*) [32])local_1040,local_1c20,auVar5);
              local_1388 = local_1828 + (long)local_17bc * 4;
              local_1cc0._0_8_ = auVar1._0_8_;
              local_1cc0._8_8_ = auVar1._8_8_;
              local_1cc0._16_8_ = auVar1._16_8_;
              local_1cc0._24_8_ = auVar1._24_8_;
              local_13c0 = local_1cc0._0_8_;
              lStack_13b8 = local_1cc0._8_8_;
              lStack_13b0 = local_1cc0._16_8_;
              uStack_13a8 = local_1cc0._24_8_;
              *local_1388 = local_1cc0._0_8_;
              local_1388[1] = local_1cc0._8_8_;
              local_1388[2] = local_1cc0._16_8_;
              local_1388[3] = local_1cc0._24_8_;
              local_1048 = local_1838 + (long)local_17bc * 4;
              auVar39 = *(undefined1 (*) [24])local_1048;
              uStack_9e8 = *(undefined8 *)*(undefined1 (*) [24])(local_1048 + 3);
              local_1ce0._0_8_ = auVar39._0_8_;
              local_1ce0._8_8_ = auVar39._8_8_;
              local_1ce0._16_8_ = auVar39._16_8_;
              local_a00 = local_1ce0._0_8_;
              uStack_9f8 = local_1ce0._8_8_;
              uStack_9f0 = local_1ce0._16_8_;
              local_a20 = local_1c40._0_8_;
              uStack_a18 = local_1c40._8_8_;
              uStack_a10 = local_1c40._16_8_;
              uStack_a08 = local_1c40._24_8_;
              local_a40 = local_1e00;
              uStack_a38 = uStack_1df8;
              uStack_a30 = uStack_1df0;
              uStack_a28 = uStack_1de8;
              auVar5 = vpblendvb_avx2(*(undefined1 (*) [32])local_1048,local_1c40,auVar5);
              local_13c8 = local_1838 + (long)local_17bc * 4;
              local_1ce0._0_8_ = auVar5._0_8_;
              local_1ce0._8_8_ = auVar5._8_8_;
              local_1ce0._16_8_ = auVar5._16_8_;
              local_1ce0._24_8_ = auVar5._24_8_;
              local_1400 = local_1ce0._0_8_;
              lStack_13f8 = local_1ce0._8_8_;
              lStack_13f0 = local_1ce0._16_8_;
              uStack_13e8 = local_1ce0._24_8_;
              *local_13c8 = local_1ce0._0_8_;
              local_13c8[1] = local_1ce0._8_8_;
              local_13c8[2] = local_1ce0._16_8_;
              local_13c8[3] = local_1ce0._24_8_;
              a_09[1] = in_stack_ffffffffffffe140;
              a_09[0] = in_stack_ffffffffffffe138;
              a_09[2] = in_stack_ffffffffffffe148;
              a_09[3] = in_stack_ffffffffffffe150;
              b_08[1] = in_stack_ffffffffffffe120;
              b_08[0] = lVar78;
              b_08[2] = in_stack_ffffffffffffe128;
              b_08[3] = in_stack_ffffffffffffe130;
              local_16e0 = local_1c60._0_8_;
              uStack_16d8 = local_1c60._8_8_;
              uStack_16d0 = local_1c60._16_8_;
              uStack_16c8 = uVar48;
              local_16a0 = local_1c60._0_8_;
              uStack_1698 = local_1c60._8_8_;
              uStack_1690 = local_1c60._16_8_;
              uStack_1688 = uVar48;
              local_1340 = local_1c60._0_8_;
              uStack_1338 = local_1c60._8_8_;
              uStack_1330 = local_1c60._16_8_;
              uStack_1328 = uVar48;
              _mm256_min_epi64_rpl(a_09,b_08);
              a_10[1] = in_stack_ffffffffffffe140;
              a_10[0] = in_stack_ffffffffffffe138;
              a_10[2] = in_stack_ffffffffffffe148;
              a_10[3] = in_stack_ffffffffffffe150;
              b_09[1] = in_stack_ffffffffffffe120;
              b_09[0] = lVar78;
              b_09[2] = in_stack_ffffffffffffe128;
              b_09[3] = in_stack_ffffffffffffe130;
              _mm256_max_epi64_rpl(a_10,b_09);
              a_11[1] = in_stack_ffffffffffffe140;
              a_11[0] = in_stack_ffffffffffffe138;
              a_11[2] = in_stack_ffffffffffffe148;
              a_11[3] = in_stack_ffffffffffffe150;
              b_10[1] = in_stack_ffffffffffffe120;
              b_10[0] = lVar78;
              b_10[2] = in_stack_ffffffffffffe128;
              b_10[3] = in_stack_ffffffffffffe130;
              _mm256_max_epi64_rpl(a_11,b_10);
              a_12[1] = in_stack_ffffffffffffe140;
              a_12[0] = in_stack_ffffffffffffe138;
              a_12[2] = in_stack_ffffffffffffe148;
              a_12[3] = in_stack_ffffffffffffe150;
              b_11[1] = in_stack_ffffffffffffe120;
              b_11[0] = lVar78;
              b_11[2] = in_stack_ffffffffffffe128;
              b_11[3] = in_stack_ffffffffffffe130;
              _mm256_max_epi64_rpl(a_12,b_11);
              a_13[1] = in_stack_ffffffffffffe140;
              a_13[0] = in_stack_ffffffffffffe138;
              a_13[2] = in_stack_ffffffffffffe148;
              a_13[3] = in_stack_ffffffffffffe150;
              b_12[1] = in_stack_ffffffffffffe120;
              b_12[0] = lVar78;
              b_12[2] = in_stack_ffffffffffffe128;
              b_12[3] = in_stack_ffffffffffffe130;
              _mm256_max_epi64_rpl(a_13,b_12);
              vH_04[0]._4_4_ = in_stack_ffffffffffffe0dc;
              vH_04[0]._0_4_ = in_stack_ffffffffffffe0d8;
              vH_04[1] = in_stack_ffffffffffffe0e0;
              vH_04[2] = in_stack_ffffffffffffe0e8;
              vH_04[3] = in_stack_ffffffffffffe0f0;
              arr_store_si256(in_stack_ffffffffffffe100,vH_04,in_stack_ffffffffffffe0d4,
                              in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0cc,
                              in_stack_ffffffffffffe0c8);
              vH_05[0]._4_4_ = in_stack_ffffffffffffe0dc;
              vH_05[0]._0_4_ = in_stack_ffffffffffffe0d8;
              vH_05[1] = in_stack_ffffffffffffe0e0;
              vH_05[2] = in_stack_ffffffffffffe0e8;
              vH_05[3] = in_stack_ffffffffffffe0f0;
              arr_store_si256(in_stack_ffffffffffffe100,vH_05,in_stack_ffffffffffffe0d4,
                              in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0cc,
                              in_stack_ffffffffffffe0c8);
              vH_06[0]._4_4_ = in_stack_ffffffffffffe0dc;
              vH_06[0]._0_4_ = in_stack_ffffffffffffe0d8;
              vH_06[1] = in_stack_ffffffffffffe0e0;
              vH_06[2] = in_stack_ffffffffffffe0e8;
              vH_06[3] = in_stack_ffffffffffffe0f0;
              arr_store_si256(in_stack_ffffffffffffe100,vH_06,in_stack_ffffffffffffe0d4,
                              in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0cc,
                              in_stack_ffffffffffffe0c8);
              vH_07[0]._4_4_ = in_stack_ffffffffffffe0dc;
              vH_07[0]._0_4_ = in_stack_ffffffffffffe0d8;
              vH_07[1] = in_stack_ffffffffffffe0e0;
              vH_07[2] = in_stack_ffffffffffffe0e8;
              vH_07[3] = in_stack_ffffffffffffe0f0;
              arr_store_si256(in_stack_ffffffffffffe100,vH_07,in_stack_ffffffffffffe0d4,
                              in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0cc,
                              in_stack_ffffffffffffe0c8);
              local_460 = local_18a0;
              uStack_458 = uStack_1898;
              uStack_450 = uStack_1890;
              uStack_448 = uStack_1888;
              auVar26._16_8_ = local_1c60._16_8_;
              auVar26._0_16_ = local_1c60._0_16_;
              auVar26._24_8_ = uVar48;
              auVar25._8_8_ = uStack_1898;
              auVar25._0_8_ = local_18a0;
              auVar25._16_8_ = uStack_1890;
              auVar25._24_8_ = uStack_1888;
              auVar71 = vpsubq_avx2(auVar26,auVar25);
              local_480 = local_1bc0._0_8_;
              uStack_478 = local_1bc0._8_8_;
              uStack_470 = uStack_1bb0;
              uStack_468 = uStack_1ba8;
              auVar24._16_8_ = auStack_18b0._0_8_;
              auVar24._0_16_ = local_18c0;
              auVar24._24_8_ = auStack_18b0._8_8_;
              _local_1bc0 = vpsubq_avx2(_local_1bc0,auVar24);
              local_1be0 = local_1bc0._0_8_;
              local_240 = local_1be0;
              lStack_1bd8 = local_1bc0._8_8_;
              lStack_238 = lStack_1bd8;
              lStack_1bd0 = local_1bc0._16_8_;
              lStack_230 = lStack_1bd0;
              lStack_1bc8 = local_1bc0._24_8_;
              lStack_228 = lStack_1bc8;
              local_1b00 = auVar71._0_8_;
              local_260 = local_1b00;
              lStack_1af8 = auVar71._8_8_;
              lStack_258 = lStack_1af8;
              lStack_1af0 = auVar71._16_8_;
              lStack_250 = lStack_1af0;
              lStack_1ae8 = auVar71._24_8_;
              lStack_248 = lStack_1ae8;
              local_a0 = vpcmpgtq_avx2(_local_1bc0,auVar71);
              local_1720 = local_1be0;
              lStack_1718 = lStack_1bd8;
              lStack_1710 = lStack_1bd0;
              lStack_1708 = lStack_1bc8;
              local_1740 = local_1b00;
              lStack_1738 = lStack_1af8;
              lStack_1730 = lStack_1af0;
              lStack_1728 = lStack_1ae8;
              local_c0 = -(ulong)(local_1be0 == local_1b00);
              lStack_b8 = -(ulong)(lStack_1bd8 == lStack_1af8);
              lStack_b0 = -(ulong)(lStack_1bd0 == lStack_1af0);
              lStack_a8 = -(ulong)(lStack_1bc8 == lStack_1ae8);
              auVar37._8_8_ = lStack_b8;
              auVar37._0_8_ = local_c0;
              auVar37._16_8_ = lStack_b0;
              auVar37._24_8_ = lStack_a8;
              local_120 = vpor_avx2(local_a0,auVar37);
              local_440 = local_1c60._0_8_;
              uStack_438 = local_1c60._8_8_;
              uStack_430 = local_1c60._16_8_;
              uStack_428 = uVar48;
              auStack_490 = auStack_18b0;
              local_4a0 = local_18c0;
              if ((((((((((((((((((((((((((((((((local_120 >> 7 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (local_120 >> 0xf & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (local_120 >> 0x17 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (local_120 >> 0x1f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (local_120 >> 0x27 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (local_120 >> 0x2f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (local_120 >> 0x37 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (local_120 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (local_120 >> 0x47 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (local_120 >> 0x4f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (local_120 >> 0x57 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (local_120 >> 0x5f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (local_120 >> 0x67 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (local_120 >> 0x6f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_120 >> 0x77 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_120 >> 0x7f,0) == '\0') &&
                                (local_120 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (local_120 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (local_120 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (local_120 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_120 >> 0xa7 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                           (local_120 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_120 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_120 >> 0xbf,0) == '\0') &&
                        (local_120 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (local_120 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_120 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (local_120 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_120 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (local_120 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_120 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < local_120[0x1f]) goto LAB_00d8631d;
              local_280 = local_1b00;
              lStack_278 = lStack_1af8;
              lStack_270 = lStack_1af0;
              lStack_268 = lStack_1ae8;
              local_2a0 = local_1be0;
              lStack_298 = lStack_1bd8;
              lStack_290 = lStack_1bd0;
              lStack_288 = lStack_1bc8;
              auVar71 = vpcmpgtq_avx2(auVar71,_local_1bc0);
              local_a60 = local_1c00._0_8_;
              uStack_a58 = local_1c00._8_8_;
              uStack_a50 = local_1c00._16_8_;
              uStack_a48 = local_1c00._24_8_;
              local_a80 = local_1ca0._0_8_;
              lStack_a78 = local_1ca0._8_8_;
              lStack_a70 = local_1ca0._16_8_;
              uStack_a68 = local_1ca0._24_8_;
              local_1e00 = auVar71._0_8_;
              local_aa0 = local_1e00;
              uStack_1df8 = auVar71._8_8_;
              uStack_a98 = uStack_1df8;
              uStack_1df0 = auVar71._16_8_;
              uStack_a90 = uStack_1df0;
              uStack_1de8 = auVar71._24_8_;
              uStack_a88 = uStack_1de8;
              local_1c00 = vpblendvb_avx2(local_1c00,auVar6,auVar71);
              local_ac0 = local_1c20._0_8_;
              uStack_ab8 = local_1c20._8_8_;
              uStack_ab0 = local_1c20._16_8_;
              uStack_aa8 = local_1c20._24_8_;
              local_ae0 = local_1cc0._0_8_;
              lStack_ad8 = local_1cc0._8_8_;
              lStack_ad0 = local_1cc0._16_8_;
              uStack_ac8 = local_1cc0._24_8_;
              local_b00 = local_1e00;
              uStack_af8 = uStack_1df8;
              uStack_af0 = uStack_1df0;
              uStack_ae8 = uStack_1de8;
              local_1c20 = vpblendvb_avx2(local_1c20,auVar1,auVar71);
              local_f40 = local_1c40._0_8_;
              uStack_f38 = local_1c40._8_8_;
              uStack_f30 = local_1c40._16_8_;
              uStack_f28 = local_1c40._24_8_;
              local_f60 = local_1920;
              uStack_f58 = uStack_1918;
              uStack_f50 = uStack_1910;
              uStack_f48 = uStack_1908;
              auVar19._8_8_ = uStack_1918;
              auVar19._0_8_ = local_1920;
              auVar19._16_8_ = uStack_1910;
              auVar19._24_8_ = uStack_1908;
              local_b20 = vpaddq_avx2(local_1c40,auVar19);
              local_f80 = local_1ce0._0_8_;
              lStack_f78 = local_1ce0._8_8_;
              lStack_f70 = local_1ce0._16_8_;
              uStack_f68 = local_1ce0._24_8_;
              local_fa0 = local_1920;
              uStack_f98 = uStack_1918;
              uStack_f90 = uStack_1910;
              uStack_f88 = uStack_1908;
              auVar18._8_8_ = uStack_1918;
              auVar18._0_8_ = local_1920;
              auVar18._16_8_ = uStack_1910;
              auVar18._24_8_ = uStack_1908;
              local_b40 = vpaddq_avx2(auVar5,auVar18);
              local_b60 = local_1e00;
              uStack_b58 = uStack_1df8;
              uStack_b50 = uStack_1df0;
              uStack_b48 = uStack_1de8;
              local_1c40 = vpblendvb_avx2(local_b20,local_b40,auVar71);
              local_1050 = local_1810 + (long)local_17bc * 4;
              _local_1d80 = *(undefined1 (*) [32])local_1050;
            }
          }
LAB_00d8631d:
          local_1058 = local_1808 + (long)local_17e4 * 4;
          auVar39 = *(undefined1 (*) [24])local_1058;
          lStack_b88 = *(long *)*(undefined1 (*) [24])(local_1058 + 3);
          local_1060 = local_1818 + (long)local_17e4 * 4;
          auVar40 = *(undefined1 (*) [24])local_1060;
          uStack_be8 = *(undefined8 *)*(undefined1 (*) [24])(local_1060 + 3);
          local_1068 = local_1828 + (long)local_17e4 * 4;
          auVar41 = *(undefined1 (*) [24])local_1068;
          uStack_c48 = *(undefined8 *)*(undefined1 (*) [24])(local_1068 + 3);
          local_1070 = local_1838 + (long)local_17e4 * 4;
          auVar42 = *(undefined1 (*) [24])local_1070;
          uStack_ca8 = *(undefined8 *)*(undefined1 (*) [24])(local_1070 + 3);
          local_1c60._0_8_ = auVar39._0_8_;
          local_2c0 = local_1c60._0_8_;
          local_1c60._8_8_ = auVar39._8_8_;
          uStack_2b8 = local_1c60._8_8_;
          local_1c60._16_8_ = auVar39._16_8_;
          uStack_2b0 = local_1c60._16_8_;
          local_2e0 = local_19e0._0_8_;
          uStack_2d8 = local_19e0._8_8_;
          uStack_2d0 = local_19e0._16_8_;
          uStack_2c8 = local_19e0._24_8_;
          auVar5 = vpcmpgtq_avx2(*(undefined1 (*) [32])local_1058,local_19e0);
          local_b80 = local_19e0._0_8_;
          uStack_b78 = local_19e0._8_8_;
          uStack_b70 = local_19e0._16_8_;
          uStack_b68 = local_19e0._24_8_;
          local_ba0 = local_1c60._0_8_;
          uStack_b98 = local_1c60._8_8_;
          uStack_b90 = local_1c60._16_8_;
          local_1e20 = auVar5._0_8_;
          local_bc0 = local_1e20;
          uStack_1e18 = auVar5._8_8_;
          uStack_bb8 = uStack_1e18;
          uStack_1e10 = auVar5._16_8_;
          uStack_bb0 = uStack_1e10;
          uStack_1e08 = auVar5._24_8_;
          uStack_ba8 = uStack_1e08;
          local_19e0 = vpblendvb_avx2(local_19e0,*(undefined1 (*) [32])local_1058,auVar5);
          local_be0 = local_1a00._0_8_;
          uStack_bd8 = local_1a00._8_8_;
          uStack_bd0 = local_1a00._16_8_;
          uStack_bc8 = local_1a00._24_8_;
          local_1ca0._0_8_ = auVar40._0_8_;
          local_c00 = local_1ca0._0_8_;
          local_1ca0._8_8_ = auVar40._8_8_;
          uStack_bf8 = local_1ca0._8_8_;
          local_1ca0._16_8_ = auVar40._16_8_;
          uStack_bf0 = local_1ca0._16_8_;
          local_c20 = local_1e20;
          uStack_c18 = uStack_1e18;
          uStack_c10 = uStack_1e10;
          uStack_c08 = uStack_1e08;
          local_1a00 = vpblendvb_avx2(local_1a00,*(undefined1 (*) [32])local_1060,auVar5);
          local_c40 = local_1a20._0_8_;
          uStack_c38 = local_1a20._8_8_;
          uStack_c30 = local_1a20._16_8_;
          uStack_c28 = local_1a20._24_8_;
          local_1cc0._0_8_ = auVar41._0_8_;
          local_c60 = local_1cc0._0_8_;
          local_1cc0._8_8_ = auVar41._8_8_;
          uStack_c58 = local_1cc0._8_8_;
          local_1cc0._16_8_ = auVar41._16_8_;
          uStack_c50 = local_1cc0._16_8_;
          local_c80 = local_1e20;
          uStack_c78 = uStack_1e18;
          uStack_c70 = uStack_1e10;
          uStack_c68 = uStack_1e08;
          local_1a20 = vpblendvb_avx2(local_1a20,*(undefined1 (*) [32])local_1068,auVar5);
          local_ca0 = local_1a40._0_8_;
          uStack_c98 = local_1a40._8_8_;
          uStack_c90 = local_1a40._16_8_;
          uStack_c88 = local_1a40._24_8_;
          local_1ce0._0_8_ = auVar42._0_8_;
          local_cc0 = local_1ce0._0_8_;
          local_1ce0._8_8_ = auVar42._8_8_;
          uStack_cb8 = local_1ce0._8_8_;
          local_1ce0._16_8_ = auVar42._16_8_;
          uStack_cb0 = local_1ce0._16_8_;
          local_ce0 = local_1e20;
          uStack_cd8 = uStack_1e18;
          uStack_cd0 = uStack_1e10;
          uStack_cc8 = uStack_1e08;
          local_1a40 = vpblendvb_avx2(local_1a40,*(undefined1 (*) [32])local_1070,auVar5);
          local_60 = local_1a60;
          lStack_58 = lStack_1a58;
          lStack_50 = lStack_1a50;
          lStack_48 = lStack_1a48;
          local_80 = local_1e20;
          uStack_78 = uStack_1e18;
          uStack_70 = uStack_1e10;
          uStack_68 = uStack_1e08;
          auVar38._8_8_ = lStack_1a58;
          auVar38._0_8_ = local_1a60;
          auVar38._16_8_ = lStack_1a50;
          auVar38._24_8_ = lStack_1a48;
          local_140 = vpand_avx2(auVar38,auVar5);
          if ((((((((((((((((((((((((((((((((local_140 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (local_140 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (local_140 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (local_140 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_140 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_140 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_140 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_140 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_140 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_140 >> 0x4f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_140 >> 0x57 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_140 >> 0x5f & (undefined1  [32])0x1) !=
                                 (undefined1  [32])0x0) ||
                                (local_140 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (local_140 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (local_140 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(local_140 >> 0x7f,0) != '\0') ||
                            (local_140 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (local_140 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (local_140 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_140 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_140 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_140 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_140 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_140 >> 0xbf,0) != '\0') ||
                    (local_140 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (local_140 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_140 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_140 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_140 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_140 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_140 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              local_140[0x1f] < '\0') {
            local_17d0 = local_17c0;
          }
          lStack_2a8 = lStack_b88;
        }
        if (s2_beg != 0) {
          for (local_17c4 = 0; local_17c4 < local_17e8; local_17c4 = local_17c4 + 1) {
            auVar52 = ZEXT816(0) << 0x40;
            auVar5 = vpermq_avx2(local_19e0,0x90);
            local_19e0 = vpblendd_avx2(auVar5,ZEXT1632(auVar52),3);
            auVar5 = vpermq_avx2(local_1a00,0x90);
            local_1a00 = vpblendd_avx2(auVar5,ZEXT1632(auVar52),3);
            auVar5 = vpermq_avx2(local_1a20,0x90);
            local_1a20 = vpblendd_avx2(auVar5,ZEXT1632(auVar52),3);
            auVar5 = vpermq_avx2(local_1a40,0x90);
            local_1a40 = vpblendd_avx2(auVar5,ZEXT1632(auVar52),3);
          }
          local_17cc = local_17c8 + -1;
          local_1928 = local_19e0._24_8_;
          local_1930 = local_1a00._24_8_;
          local_1938 = local_1a20._24_8_;
          local_1940 = local_1a40._24_8_;
        }
        if (in_stack_00000008 != 0) {
          local_1e28 = local_1808;
          local_1e30 = local_1818;
          local_1e38 = local_1828;
          local_1e40 = local_1838;
          for (local_17bc = 0; local_17bc < local_17e0 * local_17dc; local_17bc = local_17bc + 1) {
            iVar77 = local_17bc / local_17dc + (local_17bc % local_17dc) * local_17e0;
            if (iVar77 < local_17c8) {
              if ((long)local_1928 < *local_1e28) {
                local_1928 = *local_1e28;
                local_17d0 = local_17ac + -1;
                local_1930 = *local_1e30;
                local_1938 = *local_1e38;
                local_1940 = *local_1e40;
                local_17cc = iVar77;
              }
              else if (((*local_1e28 == local_1928) && (local_17d0 == local_17ac + -1)) &&
                      (iVar77 < local_17cc)) {
                local_1930 = *local_1e30;
                local_1938 = *local_1e38;
                local_1940 = *local_1e40;
                local_17cc = iVar77;
              }
            }
            local_1e28 = local_1e28 + 1;
            local_1e30 = local_1e30 + 1;
            local_1e38 = local_1e38 + 1;
            local_1e40 = local_1e40 + 1;
          }
        }
        if ((in_stack_00000008 == 0) && (s2_beg == 0)) {
          local_1078 = local_1808 + (long)local_17e4 * 4;
          local_1e80 = *(undefined1 (*) [32])local_1078;
          local_1080 = local_1818 + (long)local_17e4 * 4;
          local_1ea0 = *(undefined1 (*) [32])local_1080;
          local_1088 = local_1828 + (long)local_17e4 * 4;
          lVar82 = *local_1088;
          lVar83 = local_1088[1];
          lVar84 = local_1088[2];
          lStack_1ea8 = local_1088[3];
          local_1090 = local_1838 + (long)local_17e4 * 4;
          lVar79 = *local_1090;
          lVar80 = local_1090[1];
          lVar81 = local_1090[2];
          local_1940 = local_1090[3];
          for (local_17c4 = 0; local_17c4 < local_17e8; local_17c4 = local_17c4 + 1) {
            auVar52 = ZEXT816(0) << 0x40;
            auVar5 = vpermq_avx2(local_1e80,0x90);
            local_1e80 = vpblendd_avx2(auVar5,ZEXT1632(auVar52),3);
            auVar5 = vpermq_avx2(local_1ea0,0x90);
            local_1ea0 = vpblendd_avx2(auVar5,ZEXT1632(auVar52),3);
            auVar17._8_8_ = lVar83;
            auVar17._0_8_ = lVar82;
            auVar17._16_8_ = lVar84;
            auVar17._24_8_ = lStack_1ea8;
            auVar5 = vpermq_avx2(auVar17,0x90);
            auVar5 = vpblendd_avx2(auVar5,ZEXT1632(auVar52),3);
            lVar82 = auVar5._0_8_;
            lVar83 = auVar5._8_8_;
            lVar84 = auVar5._16_8_;
            lStack_1ea8 = auVar5._24_8_;
            auVar16._8_8_ = lVar80;
            auVar16._0_8_ = lVar79;
            auVar16._16_8_ = lVar81;
            auVar16._24_8_ = local_1940;
            auVar5 = vpermq_avx2(auVar16,0x90);
            auVar5 = vpblendd_avx2(auVar5,ZEXT1632(auVar52),3);
            lVar79 = auVar5._0_8_;
            lVar80 = auVar5._8_8_;
            lVar81 = auVar5._16_8_;
            local_1940 = auVar5._24_8_;
          }
          local_17d0 = local_17ac + -1;
          local_17cc = local_17c8 + -1;
          local_1928 = local_1e80._24_8_;
          local_1930 = local_1ea0._24_8_;
          local_1938 = lStack_1ea8;
        }
        local_300 = local_1960;
        uStack_2f8 = uStack_1958;
        uStack_2f0 = uStack_1950;
        uStack_2e8 = uStack_1948;
        local_320 = local_19a0;
        uStack_318 = uStack_1998;
        uStack_310 = uStack_1990;
        uStack_308 = uStack_1988;
        auVar34._8_8_ = uStack_1958;
        auVar34._0_8_ = local_1960;
        auVar34._16_8_ = uStack_1950;
        auVar34._24_8_ = uStack_1948;
        auVar33._8_8_ = uStack_1998;
        auVar33._0_8_ = local_19a0;
        auVar33._16_8_ = uStack_1990;
        auVar33._24_8_ = uStack_1988;
        local_e0 = vpcmpgtq_avx2(auVar34,auVar33);
        local_340 = local_19c0;
        uStack_338 = uStack_19b8;
        uStack_330 = uStack_19b0;
        uStack_328 = uStack_19a8;
        local_360 = local_1980;
        uStack_358 = uStack_1978;
        uStack_350 = uStack_1970;
        uStack_348 = uStack_1968;
        auVar32._8_8_ = uStack_19b8;
        auVar32._0_8_ = local_19c0;
        auVar32._16_8_ = uStack_19b0;
        auVar32._24_8_ = uStack_19a8;
        auVar31._8_8_ = uStack_1978;
        auVar31._0_8_ = local_1980;
        auVar31._16_8_ = uStack_1970;
        auVar31._24_8_ = uStack_1968;
        local_100 = vpcmpgtq_avx2(auVar32,auVar31);
        local_160 = vpor_avx2(local_e0,local_100);
        if ((((((((((((((((((((((((((((((((local_160 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_160 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_160 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_160 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_160 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_160 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_160 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_160 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_160 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_160 >> 0x4f & (undefined1  [32])0x1) !=
                                 (undefined1  [32])0x0) ||
                                (local_160 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (local_160 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (local_160 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || (local_160 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             ) || (local_160 >> 0x77 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(local_160 >> 0x7f,0) != '\0') ||
                          (local_160 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_160 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_160 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_160 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_160 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_160 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_160 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_160 >> 0xbf,0) != '\0') ||
                  (local_160 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_160 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_160 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_160 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_160 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_160 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_160 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_160[0x1f] < '\0') {
          local_1a68->flag = local_1a68->flag | 0x40;
          local_1928 = 0;
          local_1930 = 0;
          local_1938 = 0;
          local_1940 = 0;
          local_17cc = 0;
          local_17d0 = 0;
        }
        local_1a68->score = (int)local_1928;
        local_1a68->end_query = local_17cc;
        local_1a68->end_ref = local_17d0;
        ((local_1a68->field_4).stats)->matches = (int)local_1930;
        ((local_1a68->field_4).stats)->similar = (int)local_1938;
        ((local_1a68->field_4).stats)->length = (int)local_1940;
        parasail_free(local_1868);
        parasail_free(local_1860);
        parasail_free(local_1858);
        parasail_free(local_1850);
        parasail_free(local_1848);
        parasail_free(local_1840);
        parasail_free(local_1838);
        parasail_free(local_1830);
        parasail_free(local_1828);
        parasail_free(local_1820);
        parasail_free(local_1818);
        parasail_free(local_1810);
        parasail_free(local_1808);
        local_1798 = local_1a68;
      }
    }
  }
  return local_1798;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMStore = NULL;
    __m256i* restrict pvHMLoad = NULL;
    __m256i* restrict pvHSStore = NULL;
    __m256i* restrict pvHSLoad = NULL;
    __m256i* restrict pvHLStore = NULL;
    __m256i* restrict pvHLLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxHM;
    __m256i vMaxHS;
    __m256i vMaxHL;
    __m256i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m256i*)profile->profile64.score;
    vProfileM = (__m256i*)profile->profile64.matches;
    vProfileS = (__m256i*)profile->profile64.similar;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m256i(32, segLen);
    pvHLoad   = parasail_memalign___m256i(32, segLen);
    pvHMStore = parasail_memalign___m256i(32, segLen);
    pvHMLoad  = parasail_memalign___m256i(32, segLen);
    pvHSStore = parasail_memalign___m256i(32, segLen);
    pvHSLoad  = parasail_memalign___m256i(32, segLen);
    pvHLStore = parasail_memalign___m256i(32, segLen);
    pvHLLoad  = parasail_memalign___m256i(32, segLen);
    pvE       = parasail_memalign___m256i(32, segLen);
    pvEM      = parasail_memalign___m256i(32, segLen);
    pvES      = parasail_memalign___m256i(32, segLen);
    pvEL      = parasail_memalign___m256i(32, segLen);
    boundary  = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHMStore, vZero, segLen);
    parasail_memset___m256i(pvHSStore, vZero, segLen);
    parasail_memset___m256i(pvHLStore, vZero, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vH_dag;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        const __m256i* vP = NULL;
        const __m256i* vPM = NULL;
        const __m256i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vHM = _mm256_load_si256(&pvHMStore[segLen - 1]);
        vHS = _mm256_load_si256(&pvHSStore[segLen - 1]);
        vHL = _mm256_load_si256(&pvHLStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 8);
        vHM = _mm256_slli_si256_rpl(vHM, 8);
        vHS = _mm256_slli_si256_rpl(vHS, 8);
        vHL = _mm256_slli_si256_rpl(vHL, 8);

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m256i case1;
            __m256i case2;

            vE = _mm256_load_si256(pvE+ i);
            vEM = _mm256_load_si256(pvEM+ i);
            vES = _mm256_load_si256(pvES+ i);
            vEL = _mm256_load_si256(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vH = _mm256_max_epi64_rpl(vH_dag, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);

            case1 = _mm256_cmpeq_epi64(vH, vH_dag);
            case2 = _mm256_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi64(vHM, _mm256_load_si256(vPM + i)),
                    case1);
            _mm256_store_si256(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi64(vHS, _mm256_load_si256(vPS + i)),
                    case1);
            _mm256_store_si256(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm256_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vEL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvE + i, vE);
            _mm256_store_si256(pvEM + i, vEM);
            _mm256_store_si256(pvES + i, vES);
            _mm256_store_si256(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vFL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
            vHM = _mm256_load_si256(pvHMLoad + i);
            vHS = _mm256_load_si256(pvHSLoad + i);
            vHL = _mm256_load_si256(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vHp = _mm256_slli_si256_rpl(vHp, 8);
            vF = _mm256_slli_si256_rpl(vF, 8);
            vFM = _mm256_slli_si256_rpl(vFM, 8);
            vFS = _mm256_slli_si256_rpl(vFS, 8);
            vFL = _mm256_slli_si256_rpl(vFL, 8);
            vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            vFL = _mm256_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m256i case1;
                __m256i case2;
                __m256i cond;

                vHp = _mm256_add_epi64(vHp, _mm256_load_si256(vP + i));
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                case1 = _mm256_cmpeq_epi64(vH, vHp);
                case2 = _mm256_cmpeq_epi64(vH, vF);
                cond = _mm256_andnot_si256(case1, case2);

                /* calculate vM */
                vHM = _mm256_load_si256(pvHMStore + i);
                vHM = _mm256_blendv_epi8(vHM, vFM, cond);
                _mm256_store_si256(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm256_load_si256(pvHSStore + i);
                vHS = _mm256_blendv_epi8(vHS, vFS, cond);
                _mm256_store_si256(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm256_load_si256(pvHLStore + i);
                vHL = _mm256_blendv_epi8(vHL, vFL, cond);
                _mm256_store_si256(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm256_sub_epi64(vH, vGapO);
                vF_ext = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi64(vF_ext, vEF_opn),
                                _mm256_cmpeq_epi64(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
                vFM = _mm256_blendv_epi8(vFM, vHM, cond);
                vFS = _mm256_blendv_epi8(vFS, vHS, cond);
                vFL = _mm256_blendv_epi8(
                        _mm256_add_epi64(vFL, vOne),
                        _mm256_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m256i cond_max;
            vH = _mm256_load_si256(pvHStore + offset);
            vHM = _mm256_load_si256(pvHMStore + offset);
            vHS = _mm256_load_si256(pvHSStore + offset);
            vHL = _mm256_load_si256(pvHLStore + offset);
            cond_max = _mm256_cmpgt_epi64(vH, vMaxH);
            vMaxH = _mm256_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm256_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm256_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm256_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm256_movemask_epi8(_mm256_and_si256(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        result->stats->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        result->stats->rowcols->matches_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        result->stats->rowcols->similar_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        result->stats->rowcols->length_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        __m256i vHM = _mm256_load_si256(pvHMStore+i);
        __m256i vHS = _mm256_load_si256(pvHSStore+i);
        __m256i vHL = _mm256_load_si256(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
            vMaxHM = _mm256_slli_si256_rpl(vMaxHM, 8);
            vMaxHS = _mm256_slli_si256_rpl(vMaxHS, 8);
            vMaxHL = _mm256_slli_si256_rpl(vMaxHL, 8);
        }
        end_query = s1Len-1;
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl(vMaxHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl(vMaxHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl(vMaxHL, 3);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int64_t *m = (int64_t*)pvHMStore;
        int64_t *s = (int64_t*)pvHSStore;
        int64_t *l = (int64_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        __m256i vHM = _mm256_load_si256(pvHMStore + offset);
        __m256i vHS = _mm256_load_si256(pvHSStore + offset);
        __m256i vHL = _mm256_load_si256(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
            vHM = _mm256_slli_si256_rpl(vHM, 8);
            vHS = _mm256_slli_si256_rpl(vHS, 8);
            vHL = _mm256_slli_si256_rpl(vHL, 8);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}